

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersectorK<4,8>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  byte bVar27;
  uint uVar28;
  uint uVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar49 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  float fVar96;
  undefined4 uVar97;
  vint4 bi_2;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  vint4 bi_1;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  vint4 bi;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  vfloat4 a0_3;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  vint4 ai_2;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  vint4 ai;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  vint4 ai_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar156;
  float fVar164;
  float fVar165;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar183;
  __m128 a;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar192;
  float fVar202;
  float fVar204;
  float fVar206;
  undefined1 auVar193 [16];
  float fVar203;
  float fVar205;
  float fVar207;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar208;
  float fVar209;
  float fVar218;
  float fVar219;
  vfloat4 a0_1;
  undefined1 auVar210 [16];
  float fVar220;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  vfloat4 a0;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint local_468;
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  uint auStack_440 [4];
  RTCFilterFunctionNArguments local_430;
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar29;
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  float fVar130;
  float fVar139;
  
  PVar3 = prim[1];
  uVar24 = (ulong)(byte)PVar3;
  fVar96 = *(float *)(prim + uVar24 * 0x19 + 0x12);
  auVar36 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar36 = vsubps_avx(auVar36,*(undefined1 (*) [16])(prim + uVar24 * 0x19 + 6));
  auVar57._0_4_ = fVar96 * auVar36._0_4_;
  auVar57._4_4_ = fVar96 * auVar36._4_4_;
  auVar57._8_4_ = fVar96 * auVar36._8_4_;
  auVar57._12_4_ = fVar96 * auVar36._12_4_;
  auVar45._0_4_ = fVar96 * auVar37._0_4_;
  auVar45._4_4_ = fVar96 * auVar37._4_4_;
  auVar45._8_4_ = fVar96 * auVar37._8_4_;
  auVar45._12_4_ = fVar96 * auVar37._12_4_;
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 4 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 5 + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 6 + 6)));
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0xb + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar48 = vcvtdq2ps_avx(auVar48);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar24 + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  uVar35 = (ulong)(uint)((int)(uVar24 * 9) * 2);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar35 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar35 + uVar24 + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  uVar22 = (ulong)(uint)((int)(uVar24 * 5) << 2);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar61._4_4_ = auVar45._0_4_;
  auVar61._0_4_ = auVar45._0_4_;
  auVar61._8_4_ = auVar45._0_4_;
  auVar61._12_4_ = auVar45._0_4_;
  auVar40 = vshufps_avx(auVar45,auVar45,0x55);
  auVar39 = vshufps_avx(auVar45,auVar45,0xaa);
  fVar96 = auVar39._0_4_;
  auVar53._0_4_ = fVar96 * auVar38._0_4_;
  fVar208 = auVar39._4_4_;
  auVar53._4_4_ = fVar208 * auVar38._4_4_;
  fVar192 = auVar39._8_4_;
  auVar53._8_4_ = fVar192 * auVar38._8_4_;
  fVar203 = auVar39._12_4_;
  auVar53._12_4_ = fVar203 * auVar38._12_4_;
  auVar58._0_4_ = auVar44._0_4_ * fVar96;
  auVar58._4_4_ = auVar44._4_4_ * fVar208;
  auVar58._8_4_ = auVar44._8_4_ * fVar192;
  auVar58._12_4_ = auVar44._12_4_ * fVar203;
  auVar46._0_4_ = auVar41._0_4_ * fVar96;
  auVar46._4_4_ = auVar41._4_4_ * fVar208;
  auVar46._8_4_ = auVar41._8_4_ * fVar192;
  auVar46._12_4_ = auVar41._12_4_ * fVar203;
  auVar39 = vfmadd231ps_fma(auVar53,auVar40,auVar37);
  auVar42 = vfmadd231ps_fma(auVar58,auVar40,auVar48);
  auVar40 = vfmadd231ps_fma(auVar46,auVar50,auVar40);
  auVar43 = vfmadd231ps_fma(auVar39,auVar61,auVar36);
  auVar42 = vfmadd231ps_fma(auVar42,auVar61,auVar47);
  auVar45 = vfmadd231ps_fma(auVar40,auVar14,auVar61);
  auVar62._4_4_ = auVar57._0_4_;
  auVar62._0_4_ = auVar57._0_4_;
  auVar62._8_4_ = auVar57._0_4_;
  auVar62._12_4_ = auVar57._0_4_;
  auVar40 = vshufps_avx(auVar57,auVar57,0x55);
  auVar39 = vshufps_avx(auVar57,auVar57,0xaa);
  fVar96 = auVar39._0_4_;
  auVar228._0_4_ = fVar96 * auVar38._0_4_;
  fVar208 = auVar39._4_4_;
  auVar228._4_4_ = fVar208 * auVar38._4_4_;
  fVar192 = auVar39._8_4_;
  auVar228._8_4_ = fVar192 * auVar38._8_4_;
  fVar203 = auVar39._12_4_;
  auVar228._12_4_ = fVar203 * auVar38._12_4_;
  auVar56._0_4_ = auVar44._0_4_ * fVar96;
  auVar56._4_4_ = auVar44._4_4_ * fVar208;
  auVar56._8_4_ = auVar44._8_4_ * fVar192;
  auVar56._12_4_ = auVar44._12_4_ * fVar203;
  auVar55._0_4_ = auVar41._0_4_ * fVar96;
  auVar55._4_4_ = auVar41._4_4_ * fVar208;
  auVar55._8_4_ = auVar41._8_4_ * fVar192;
  auVar55._12_4_ = auVar41._12_4_ * fVar203;
  auVar37 = vfmadd231ps_fma(auVar228,auVar40,auVar37);
  auVar38 = vfmadd231ps_fma(auVar56,auVar40,auVar48);
  auVar48 = vfmadd231ps_fma(auVar55,auVar40,auVar50);
  auVar44 = vfmadd231ps_fma(auVar37,auVar62,auVar36);
  auVar50 = vfmadd231ps_fma(auVar38,auVar62,auVar47);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar239 = ZEXT1664(auVar36);
  auVar41 = vfmadd231ps_fma(auVar48,auVar62,auVar14);
  auVar37 = vandps_avx512vl(auVar43,auVar36);
  auVar52._8_4_ = 0x219392ef;
  auVar52._0_8_ = 0x219392ef219392ef;
  auVar52._12_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar37,auVar52,1);
  bVar21 = (bool)((byte)uVar35 & 1);
  auVar39._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar43._0_4_;
  bVar21 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar39._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar43._4_4_;
  bVar21 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar39._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar43._8_4_;
  bVar21 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar39._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar43._12_4_;
  auVar37 = vandps_avx512vl(auVar42,auVar36);
  uVar35 = vcmpps_avx512vl(auVar37,auVar52,1);
  bVar21 = (bool)((byte)uVar35 & 1);
  auVar43._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar42._0_4_;
  bVar21 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar42._4_4_;
  bVar21 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar42._8_4_;
  bVar21 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar43._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar42._12_4_;
  auVar36 = vandps_avx512vl(auVar45,auVar36);
  uVar35 = vcmpps_avx512vl(auVar36,auVar52,1);
  bVar21 = (bool)((byte)uVar35 & 1);
  auVar42._0_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar45._0_4_;
  bVar21 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar45._4_4_;
  bVar21 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar45._8_4_;
  bVar21 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar42._12_4_ = (uint)bVar21 * 0x219392ef | (uint)!bVar21 * auVar45._12_4_;
  auVar36 = vrcp14ps_avx512vl(auVar39);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar240 = ZEXT1664(auVar37);
  auVar38 = vfnmadd213ps_avx512vl(auVar39,auVar36,auVar37);
  auVar47 = vfmadd132ps_fma(auVar38,auVar36,auVar36);
  auVar36 = vrcp14ps_avx512vl(auVar43);
  auVar38 = vfnmadd213ps_avx512vl(auVar43,auVar36,auVar37);
  auVar48 = vfmadd132ps_fma(auVar38,auVar36,auVar36);
  auVar36 = vrcp14ps_avx512vl(auVar42);
  auVar37 = vfnmadd213ps_avx512vl(auVar42,auVar36,auVar37);
  auVar14 = vfmadd132ps_fma(auVar37,auVar36,auVar36);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar24 * 7 + 6);
  auVar36 = vpmovsxwd_avx(auVar36);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar44);
  auVar51._0_4_ = auVar47._0_4_ * auVar36._0_4_;
  auVar51._4_4_ = auVar47._4_4_ * auVar36._4_4_;
  auVar51._8_4_ = auVar47._8_4_ * auVar36._8_4_;
  auVar51._12_4_ = auVar47._12_4_ * auVar36._12_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar24 * 9 + 6);
  auVar36 = vpmovsxwd_avx(auVar37);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar44);
  auVar39 = vpbroadcastd_avx512vl();
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar37 = vpmovsxwd_avx(auVar38);
  auVar54._0_4_ = auVar47._0_4_ * auVar36._0_4_;
  auVar54._4_4_ = auVar47._4_4_ * auVar36._4_4_;
  auVar54._8_4_ = auVar47._8_4_ * auVar36._8_4_;
  auVar54._12_4_ = auVar47._12_4_ * auVar36._12_4_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar24 * -2 + 6);
  auVar36 = vpmovsxwd_avx(auVar47);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar50);
  auVar59._0_4_ = auVar48._0_4_ * auVar36._0_4_;
  auVar59._4_4_ = auVar48._4_4_ * auVar36._4_4_;
  auVar59._8_4_ = auVar48._8_4_ * auVar36._8_4_;
  auVar59._12_4_ = auVar48._12_4_ * auVar36._12_4_;
  auVar36 = vcvtdq2ps_avx(auVar37);
  auVar36 = vsubps_avx(auVar36,auVar50);
  auVar60._0_4_ = auVar48._0_4_ * auVar36._0_4_;
  auVar60._4_4_ = auVar48._4_4_ * auVar36._4_4_;
  auVar60._8_4_ = auVar48._8_4_ * auVar36._8_4_;
  auVar60._12_4_ = auVar48._12_4_ * auVar36._12_4_;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar22 + uVar24 + 6);
  auVar36 = vpmovsxwd_avx(auVar48);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar41);
  auVar63._0_4_ = auVar14._0_4_ * auVar36._0_4_;
  auVar63._4_4_ = auVar14._4_4_ * auVar36._4_4_;
  auVar63._8_4_ = auVar14._8_4_ * auVar36._8_4_;
  auVar63._12_4_ = auVar14._12_4_ * auVar36._12_4_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar24 * 0x17 + 6);
  auVar36 = vpmovsxwd_avx(auVar44);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar36 = vsubps_avx(auVar36,auVar41);
  auVar49._0_4_ = auVar14._0_4_ * auVar36._0_4_;
  auVar49._4_4_ = auVar14._4_4_ * auVar36._4_4_;
  auVar49._8_4_ = auVar14._8_4_ * auVar36._8_4_;
  auVar49._12_4_ = auVar14._12_4_ * auVar36._12_4_;
  auVar36 = vpminsd_avx(auVar51,auVar54);
  auVar37 = vpminsd_avx(auVar59,auVar60);
  auVar36 = vmaxps_avx(auVar36,auVar37);
  auVar37 = vpminsd_avx(auVar63,auVar49);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar14._4_4_ = uVar97;
  auVar14._0_4_ = uVar97;
  auVar14._8_4_ = uVar97;
  auVar14._12_4_ = uVar97;
  auVar37 = vmaxps_avx512vl(auVar37,auVar14);
  auVar36 = vmaxps_avx(auVar36,auVar37);
  auVar50._8_4_ = 0x3f7ffffa;
  auVar50._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar50._12_4_ = 0x3f7ffffa;
  local_3a0 = vmulps_avx512vl(auVar36,auVar50);
  auVar36 = vpmaxsd_avx(auVar51,auVar54);
  auVar37 = vpmaxsd_avx(auVar59,auVar60);
  auVar36 = vminps_avx(auVar36,auVar37);
  auVar37 = vpmaxsd_avx(auVar63,auVar49);
  uVar97 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar41._4_4_ = uVar97;
  auVar41._0_4_ = uVar97;
  auVar41._8_4_ = uVar97;
  auVar41._12_4_ = uVar97;
  auVar37 = vminps_avx512vl(auVar37,auVar41);
  auVar36 = vminps_avx(auVar36,auVar37);
  auVar40._8_4_ = 0x3f800003;
  auVar40._0_8_ = 0x3f8000033f800003;
  auVar40._12_4_ = 0x3f800003;
  auVar36 = vmulps_avx512vl(auVar36,auVar40);
  uVar15 = vcmpps_avx512vl(local_3a0,auVar36,2);
  uVar35 = vpcmpgtd_avx512vl(auVar39,_DAT_01f7fcf0);
  uVar35 = ((byte)uVar15 & 0xf) & uVar35;
  if ((char)uVar35 == '\0') {
    return false;
  }
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar234 = ZEXT1664(auVar36);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar235 = ZEXT1664(auVar36);
  auVar242 = ZEXT464(0x3f800000);
  auVar36 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar241 = ZEXT1664(auVar36);
LAB_01ab05bf:
  lVar26 = 0;
  for (uVar22 = uVar35; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
    lVar26 = lVar26 + 1;
  }
  uVar4 = *(uint *)(prim + 2);
  pGVar6 = (context->scene->geometries).items[uVar4].ptr;
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar22 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           (ulong)*(uint *)(prim + lVar26 * 4 + 6) *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar36 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar22);
  lVar26 = uVar22 + 1;
  auVar37 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar26);
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar38 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar22);
  auVar47 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar26);
  local_1e0 = vpbroadcastd_avx512vl();
  auVar48 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar48 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar41 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar22),
                       auVar36,auVar40);
  auVar39 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar26),
                       auVar37,auVar40);
  auVar42 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + uVar22 * *(long *)&pGVar6[3].fnumTimeSegments),
                       auVar38,auVar40);
  auVar43 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar26),
                       auVar47,auVar40);
  auVar49 = ZEXT816(0) << 0x40;
  auVar157._0_4_ = auVar37._0_4_ * 0.0;
  auVar157._4_4_ = auVar37._4_4_ * 0.0;
  auVar157._8_4_ = auVar37._8_4_ * 0.0;
  auVar157._12_4_ = auVar37._12_4_ * 0.0;
  auVar14 = vfmadd231ps_fma(auVar157,auVar39,auVar49);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar41,auVar14);
  auVar166._0_4_ = auVar44._0_4_ + auVar36._0_4_;
  auVar166._4_4_ = auVar44._4_4_ + auVar36._4_4_;
  auVar166._8_4_ = auVar44._8_4_ + auVar36._8_4_;
  auVar166._12_4_ = auVar44._12_4_ + auVar36._12_4_;
  auVar58 = auVar234._0_16_;
  auVar44 = vfmadd231ps_avx512vl(auVar14,auVar41,auVar58);
  auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar36,auVar58);
  auVar210._0_4_ = auVar47._0_4_ * 0.0;
  auVar210._4_4_ = auVar47._4_4_ * 0.0;
  auVar210._8_4_ = auVar47._8_4_ * 0.0;
  auVar210._12_4_ = auVar47._12_4_ * 0.0;
  auVar14 = vfmadd231ps_fma(auVar210,auVar43,auVar49);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar42,auVar14);
  auVar221._0_4_ = auVar44._0_4_ + auVar38._0_4_;
  auVar221._4_4_ = auVar44._4_4_ + auVar38._4_4_;
  auVar221._8_4_ = auVar44._8_4_ + auVar38._8_4_;
  auVar221._12_4_ = auVar44._12_4_ + auVar38._12_4_;
  auVar44 = vfmadd231ps_avx512vl(auVar14,auVar42,auVar58);
  auVar46 = vfnmadd231ps_avx512vl(auVar44,auVar38,auVar58);
  auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar39,auVar37);
  auVar44 = vfmadd231ps_fma(auVar44,auVar41,auVar49);
  auVar50 = vfmadd231ps_fma(auVar44,auVar36,auVar49);
  auVar37 = vmulps_avx512vl(auVar37,auVar58);
  auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar58,auVar39);
  auVar37 = vfmadd231ps_fma(auVar37,auVar49,auVar41);
  auVar41 = vfnmadd231ps_fma(auVar37,auVar49,auVar36);
  auVar36 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar43,auVar47);
  auVar36 = vfmadd231ps_fma(auVar36,auVar42,auVar49);
  auVar44 = vfmadd231ps_fma(auVar36,auVar38,auVar49);
  auVar36 = vmulps_avx512vl(auVar47,auVar58);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar58,auVar43);
  auVar36 = vfmadd231ps_fma(auVar36,auVar49,auVar42);
  auVar14 = vfnmadd231ps_fma(auVar36,auVar49,auVar38);
  auVar36 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar37 = vshufps_avx(auVar221,auVar221,0xc9);
  fVar156 = auVar45._0_4_;
  auVar131._0_4_ = fVar156 * auVar37._0_4_;
  fVar164 = auVar45._4_4_;
  auVar131._4_4_ = fVar164 * auVar37._4_4_;
  fVar165 = auVar45._8_4_;
  auVar131._8_4_ = fVar165 * auVar37._8_4_;
  fVar207 = auVar45._12_4_;
  auVar131._12_4_ = fVar207 * auVar37._12_4_;
  auVar37 = vfmsub231ps_fma(auVar131,auVar36,auVar221);
  auVar38 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar140._0_4_ = fVar156 * auVar37._0_4_;
  auVar140._4_4_ = fVar164 * auVar37._4_4_;
  auVar140._8_4_ = fVar165 * auVar37._8_4_;
  auVar140._12_4_ = fVar207 * auVar37._12_4_;
  auVar36 = vfmsub231ps_fma(auVar140,auVar36,auVar46);
  auVar47 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar37 = vshufps_avx(auVar44,auVar44,0xc9);
  fVar96 = auVar41._0_4_;
  auVar184._0_4_ = auVar37._0_4_ * fVar96;
  fVar208 = auVar41._4_4_;
  auVar184._4_4_ = auVar37._4_4_ * fVar208;
  fVar192 = auVar41._8_4_;
  auVar184._8_4_ = auVar37._8_4_ * fVar192;
  fVar203 = auVar41._12_4_;
  auVar184._12_4_ = auVar37._12_4_ * fVar203;
  auVar37 = vfmsub231ps_fma(auVar184,auVar36,auVar44);
  auVar44 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar185._0_4_ = auVar37._0_4_ * fVar96;
  auVar185._4_4_ = auVar37._4_4_ * fVar208;
  auVar185._8_4_ = auVar37._8_4_ * fVar192;
  auVar185._12_4_ = auVar37._12_4_ * fVar203;
  auVar36 = vfmsub231ps_fma(auVar185,auVar36,auVar14);
  auVar14 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar36 = vdpps_avx(auVar38,auVar38,0x7f);
  fVar205 = auVar36._0_4_;
  auVar186._4_12_ = ZEXT812(0) << 0x20;
  auVar186._0_4_ = fVar205;
  auVar37 = vrsqrt14ss_avx512f(auVar49,auVar186);
  auVar39 = vmulss_avx512f(auVar37,ZEXT416(0x3fc00000));
  auVar42 = vmulss_avx512f(auVar36,ZEXT416(0x3f000000));
  fVar130 = auVar37._0_4_;
  fVar139 = auVar39._0_4_ - auVar42._0_4_ * fVar130 * fVar130 * fVar130;
  fVar209 = fVar139 * auVar38._0_4_;
  fVar218 = fVar139 * auVar38._4_4_;
  fVar219 = fVar139 * auVar38._8_4_;
  fVar220 = fVar139 * auVar38._12_4_;
  auVar37 = vdpps_avx(auVar38,auVar47,0x7f);
  auVar141._0_4_ = fVar205 * auVar47._0_4_;
  auVar141._4_4_ = fVar205 * auVar47._4_4_;
  auVar141._8_4_ = fVar205 * auVar47._8_4_;
  auVar141._12_4_ = fVar205 * auVar47._12_4_;
  fVar205 = auVar37._0_4_;
  auVar132._0_4_ = fVar205 * auVar38._0_4_;
  auVar132._4_4_ = fVar205 * auVar38._4_4_;
  auVar132._8_4_ = fVar205 * auVar38._8_4_;
  auVar132._12_4_ = fVar205 * auVar38._12_4_;
  auVar38 = vsubps_avx(auVar141,auVar132);
  auVar37 = vrcp14ss_avx512f(auVar49,auVar186);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar37,ZEXT416(0x40000000));
  fVar205 = auVar37._0_4_ * auVar36._0_4_;
  auVar36 = vdpps_avx(auVar44,auVar44,0x7f);
  fVar130 = auVar36._0_4_;
  auVar133._4_12_ = ZEXT812(0) << 0x20;
  auVar133._0_4_ = fVar130;
  auVar37 = vrsqrt14ss_avx512f(auVar49,auVar133);
  auVar47 = vmulss_avx512f(auVar37,ZEXT416(0x3fc00000));
  auVar39 = vmulss_avx512f(auVar36,ZEXT416(0x3f000000));
  fVar183 = auVar37._0_4_;
  fVar183 = auVar47._0_4_ - auVar39._0_4_ * fVar183 * fVar183 * fVar183;
  fVar191 = fVar183 * auVar44._0_4_;
  fVar202 = fVar183 * auVar44._4_4_;
  fVar204 = fVar183 * auVar44._8_4_;
  fVar206 = fVar183 * auVar44._12_4_;
  auVar37 = vdpps_avx(auVar44,auVar14,0x7f);
  auVar110._0_4_ = fVar130 * auVar14._0_4_;
  auVar110._4_4_ = fVar130 * auVar14._4_4_;
  auVar110._8_4_ = fVar130 * auVar14._8_4_;
  auVar110._12_4_ = fVar130 * auVar14._12_4_;
  fVar130 = auVar37._0_4_;
  auVar98._0_4_ = fVar130 * auVar44._0_4_;
  auVar98._4_4_ = fVar130 * auVar44._4_4_;
  auVar98._8_4_ = fVar130 * auVar44._8_4_;
  auVar98._12_4_ = fVar130 * auVar44._12_4_;
  auVar47 = vsubps_avx(auVar110,auVar98);
  auVar37 = vrcp14ss_avx512f(auVar49,auVar133);
  auVar36 = vfnmadd213ss_avx512f(auVar36,auVar37,ZEXT416(0x40000000));
  fVar130 = auVar37._0_4_ * auVar36._0_4_;
  auVar36 = vshufps_avx(auVar166,auVar166,0xff);
  auVar134._0_4_ = fVar209 * auVar36._0_4_;
  auVar134._4_4_ = fVar218 * auVar36._4_4_;
  auVar134._8_4_ = fVar219 * auVar36._8_4_;
  auVar134._12_4_ = fVar220 * auVar36._12_4_;
  local_320 = vsubps_avx(auVar166,auVar134);
  auVar37 = vshufps_avx(auVar45,auVar45,0xff);
  auVar111._0_4_ = fVar209 * auVar37._0_4_ + auVar36._0_4_ * fVar139 * auVar38._0_4_ * fVar205;
  auVar111._4_4_ = fVar218 * auVar37._4_4_ + auVar36._4_4_ * fVar139 * auVar38._4_4_ * fVar205;
  auVar111._8_4_ = fVar219 * auVar37._8_4_ + auVar36._8_4_ * fVar139 * auVar38._8_4_ * fVar205;
  auVar111._12_4_ = fVar220 * auVar37._12_4_ + auVar36._12_4_ * fVar139 * auVar38._12_4_ * fVar205;
  auVar38 = vsubps_avx(auVar45,auVar111);
  local_330._0_4_ = auVar166._0_4_ + auVar134._0_4_;
  local_330._4_4_ = auVar166._4_4_ + auVar134._4_4_;
  fStack_328 = auVar166._8_4_ + auVar134._8_4_;
  fStack_324 = auVar166._12_4_ + auVar134._12_4_;
  auVar112._0_4_ = fVar156 + auVar111._0_4_;
  auVar112._4_4_ = fVar164 + auVar111._4_4_;
  auVar112._8_4_ = fVar165 + auVar111._8_4_;
  auVar112._12_4_ = fVar207 + auVar111._12_4_;
  auVar36 = vshufps_avx(auVar50,auVar50,0xff);
  auVar142._0_4_ = fVar191 * auVar36._0_4_;
  auVar142._4_4_ = fVar202 * auVar36._4_4_;
  auVar142._8_4_ = fVar204 * auVar36._8_4_;
  auVar142._12_4_ = fVar206 * auVar36._12_4_;
  local_340 = vsubps_avx(auVar50,auVar142);
  auVar37 = vshufps_avx(auVar41,auVar41,0xff);
  auVar99._0_4_ = fVar191 * auVar37._0_4_ + auVar36._0_4_ * fVar183 * auVar47._0_4_ * fVar130;
  auVar99._4_4_ = fVar202 * auVar37._4_4_ + auVar36._4_4_ * fVar183 * auVar47._4_4_ * fVar130;
  auVar99._8_4_ = fVar204 * auVar37._8_4_ + auVar36._8_4_ * fVar183 * auVar47._8_4_ * fVar130;
  auVar99._12_4_ = fVar206 * auVar37._12_4_ + auVar36._12_4_ * fVar183 * auVar47._12_4_ * fVar130;
  auVar36 = vsubps_avx(auVar41,auVar99);
  _local_350 = vaddps_avx512vl(auVar50,auVar142);
  auVar100._0_4_ = fVar96 + auVar99._0_4_;
  auVar100._4_4_ = fVar208 + auVar99._4_4_;
  auVar100._8_4_ = fVar192 + auVar99._8_4_;
  auVar100._12_4_ = fVar203 + auVar99._12_4_;
  auVar37 = vmulps_avx512vl(auVar38,auVar40);
  local_360 = vaddps_avx512vl(local_320,auVar37);
  auVar36 = vmulps_avx512vl(auVar36,auVar40);
  local_370 = vsubps_avx512vl(local_340,auVar36);
  auVar36 = vmulps_avx512vl(auVar112,auVar40);
  _local_380 = vaddps_avx512vl(_local_330,auVar36);
  auVar36 = vmulps_avx512vl(auVar100,auVar40);
  _local_390 = vsubps_avx512vl(_local_350,auVar36);
  local_2a0 = vsubps_avx(local_320,auVar48);
  uVar97 = local_2a0._0_4_;
  auVar106._4_4_ = uVar97;
  auVar106._0_4_ = uVar97;
  auVar106._8_4_ = uVar97;
  auVar106._12_4_ = uVar97;
  auVar36 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar37 = vshufps_avx(local_2a0,local_2a0,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar96 = pre->ray_space[k].vz.field_0.m128[0];
  fVar208 = pre->ray_space[k].vz.field_0.m128[1];
  fVar192 = pre->ray_space[k].vz.field_0.m128[2];
  fVar203 = pre->ray_space[k].vz.field_0.m128[3];
  auVar101._0_4_ = fVar96 * auVar37._0_4_;
  auVar101._4_4_ = fVar208 * auVar37._4_4_;
  auVar101._8_4_ = fVar192 * auVar37._8_4_;
  auVar101._12_4_ = fVar203 * auVar37._12_4_;
  auVar36 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar2,auVar36);
  auVar50 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar106);
  local_2b0 = vsubps_avx512vl(local_360,auVar48);
  uVar97 = local_2b0._0_4_;
  auVar113._4_4_ = uVar97;
  auVar113._0_4_ = uVar97;
  auVar113._8_4_ = uVar97;
  auVar113._12_4_ = uVar97;
  auVar36 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar37 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar107._0_4_ = fVar96 * auVar37._0_4_;
  auVar107._4_4_ = fVar208 * auVar37._4_4_;
  auVar107._8_4_ = fVar192 * auVar37._8_4_;
  auVar107._12_4_ = fVar203 * auVar37._12_4_;
  auVar36 = vfmadd231ps_fma(auVar107,(undefined1  [16])aVar2,auVar36);
  auVar41 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar113);
  local_2c0 = vsubps_avx512vl(local_370,auVar48);
  uVar97 = local_2c0._0_4_;
  auVar114._4_4_ = uVar97;
  auVar114._0_4_ = uVar97;
  auVar114._8_4_ = uVar97;
  auVar114._12_4_ = uVar97;
  auVar36 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar37 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar167._0_4_ = auVar37._0_4_ * fVar96;
  auVar167._4_4_ = auVar37._4_4_ * fVar208;
  auVar167._8_4_ = auVar37._8_4_ * fVar192;
  auVar167._12_4_ = auVar37._12_4_ * fVar203;
  auVar36 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar2,auVar36);
  auVar40 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar114);
  local_2d0 = vsubps_avx(local_340,auVar48);
  uVar97 = local_2d0._0_4_;
  auVar115._4_4_ = uVar97;
  auVar115._0_4_ = uVar97;
  auVar115._8_4_ = uVar97;
  auVar115._12_4_ = uVar97;
  auVar36 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar37 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar173._0_4_ = auVar37._0_4_ * fVar96;
  auVar173._4_4_ = auVar37._4_4_ * fVar208;
  auVar173._8_4_ = auVar37._8_4_ * fVar192;
  auVar173._12_4_ = auVar37._12_4_ * fVar203;
  auVar36 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar2,auVar36);
  auVar39 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar115);
  local_2e0 = vsubps_avx(_local_330,auVar48);
  uVar97 = local_2e0._0_4_;
  auVar116._4_4_ = uVar97;
  auVar116._0_4_ = uVar97;
  auVar116._8_4_ = uVar97;
  auVar116._12_4_ = uVar97;
  auVar36 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar37 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar187._0_4_ = auVar37._0_4_ * fVar96;
  auVar187._4_4_ = auVar37._4_4_ * fVar208;
  auVar187._8_4_ = auVar37._8_4_ * fVar192;
  auVar187._12_4_ = auVar37._12_4_ * fVar203;
  auVar36 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar2,auVar36);
  auVar42 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar116);
  local_2f0 = vsubps_avx512vl(_local_380,auVar48);
  uVar97 = local_2f0._0_4_;
  auVar117._4_4_ = uVar97;
  auVar117._0_4_ = uVar97;
  auVar117._8_4_ = uVar97;
  auVar117._12_4_ = uVar97;
  auVar36 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar37 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar193._0_4_ = auVar37._0_4_ * fVar96;
  auVar193._4_4_ = auVar37._4_4_ * fVar208;
  auVar193._8_4_ = auVar37._8_4_ * fVar192;
  auVar193._12_4_ = auVar37._12_4_ * fVar203;
  auVar36 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar2,auVar36);
  auVar43 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar117);
  local_300 = vsubps_avx512vl(_local_390,auVar48);
  uVar97 = local_300._0_4_;
  auVar118._4_4_ = uVar97;
  auVar118._0_4_ = uVar97;
  auVar118._8_4_ = uVar97;
  auVar118._12_4_ = uVar97;
  auVar36 = vshufps_avx(local_300,local_300,0x55);
  auVar37 = vshufps_avx(local_300,local_300,0xaa);
  auVar211._0_4_ = auVar37._0_4_ * fVar96;
  auVar211._4_4_ = auVar37._4_4_ * fVar208;
  auVar211._8_4_ = auVar37._8_4_ * fVar192;
  auVar211._12_4_ = auVar37._12_4_ * fVar203;
  auVar36 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar2,auVar36);
  auVar45 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar118);
  local_310 = vsubps_avx512vl(_local_350,auVar48);
  uVar97 = local_310._0_4_;
  auVar119._4_4_ = uVar97;
  auVar119._0_4_ = uVar97;
  auVar119._8_4_ = uVar97;
  auVar119._12_4_ = uVar97;
  auVar36 = vshufps_avx(local_310,local_310,0x55);
  auVar37 = vshufps_avx(local_310,local_310,0xaa);
  auVar143._0_4_ = fVar96 * auVar37._0_4_;
  auVar143._4_4_ = fVar208 * auVar37._4_4_;
  auVar143._8_4_ = fVar192 * auVar37._8_4_;
  auVar143._12_4_ = fVar203 * auVar37._12_4_;
  auVar36 = vfmadd231ps_fma(auVar143,(undefined1  [16])aVar2,auVar36);
  auVar46 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar1,auVar119);
  auVar38 = vmovlhps_avx(auVar50,auVar42);
  auVar47 = vmovlhps_avx(auVar41,auVar43);
  auVar44 = vmovlhps_avx512f(auVar40,auVar45);
  auVar14 = vmovlhps_avx512f(auVar39,auVar46);
  auVar37 = vminps_avx(auVar38,auVar47);
  auVar36 = vmaxps_avx(auVar38,auVar47);
  auVar48 = vminps_avx512vl(auVar44,auVar14);
  auVar37 = vminps_avx(auVar37,auVar48);
  auVar48 = vmaxps_avx512vl(auVar44,auVar14);
  auVar36 = vmaxps_avx(auVar36,auVar48);
  auVar48 = vshufpd_avx(auVar37,auVar37,3);
  auVar37 = vminps_avx(auVar37,auVar48);
  auVar48 = vshufpd_avx(auVar36,auVar36,3);
  auVar36 = vmaxps_avx(auVar36,auVar48);
  auVar37 = vandps_avx512vl(auVar37,auVar239._0_16_);
  auVar36 = vandps_avx512vl(auVar36,auVar239._0_16_);
  auVar36 = vmaxps_avx(auVar37,auVar36);
  auVar37 = vmovshdup_avx(auVar36);
  auVar36 = vmaxss_avx(auVar37,auVar36);
  local_468 = (uint)uVar35 + 0xf;
  fVar96 = auVar36._0_4_ * 9.536743e-07;
  auVar37 = vmovddup_avx512vl(auVar50);
  auVar48 = vmovddup_avx512vl(auVar41);
  auVar168._0_8_ = auVar40._0_8_;
  auVar168._8_8_ = auVar168._0_8_;
  auVar174._0_8_ = auVar39._0_8_;
  auVar174._8_8_ = auVar174._0_8_;
  local_260 = vbroadcastss_avx512vl(ZEXT416((uint)fVar96));
  auVar36 = vxorps_avx512vl(local_260._0_16_,auVar235._0_16_);
  local_1c0 = auVar36._0_4_;
  uStack_1bc = local_1c0;
  uStack_1b8 = local_1c0;
  uStack_1b4 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1ac = local_1c0;
  uStack_1a8 = local_1c0;
  uStack_1a4 = local_1c0;
  bVar21 = false;
  uVar22 = 0;
  uVar30 = *(uint *)(ray + k * 4 + 0x60);
  local_270 = vsubps_avx(auVar47,auVar38);
  local_280 = vsubps_avx512vl(auVar44,auVar47);
  local_290 = vsubps_avx512vl(auVar14,auVar44);
  local_3b0 = vsubps_avx(_local_330,local_320);
  local_3c0 = vsubps_avx512vl(_local_380,local_360);
  local_3d0 = vsubps_avx512vl(_local_390,local_370);
  _local_3e0 = vsubps_avx512vl(_local_350,local_340);
  local_200 = vpbroadcastd_avx512vl();
  auVar36 = ZEXT816(0x3f80000000000000);
  auVar108 = auVar36;
LAB_01ab0cb2:
  do {
    auVar50 = vshufps_avx(auVar108,auVar108,0x50);
    auVar225._8_4_ = 0x3f800000;
    auVar225._0_8_ = 0x3f8000003f800000;
    auVar225._12_4_ = 0x3f800000;
    auVar84._16_4_ = 0x3f800000;
    auVar84._0_16_ = auVar225;
    auVar84._20_4_ = 0x3f800000;
    auVar84._24_4_ = 0x3f800000;
    auVar84._28_4_ = 0x3f800000;
    auVar41 = vsubps_avx(auVar225,auVar50);
    fVar208 = auVar50._0_4_;
    fVar130 = auVar42._0_4_;
    auVar135._0_4_ = fVar130 * fVar208;
    fVar192 = auVar50._4_4_;
    fVar139 = auVar42._4_4_;
    auVar135._4_4_ = fVar139 * fVar192;
    fVar203 = auVar50._8_4_;
    auVar135._8_4_ = fVar130 * fVar203;
    fVar205 = auVar50._12_4_;
    auVar135._12_4_ = fVar139 * fVar205;
    fVar183 = auVar43._0_4_;
    auVar144._0_4_ = fVar183 * fVar208;
    fVar156 = auVar43._4_4_;
    auVar144._4_4_ = fVar156 * fVar192;
    auVar144._8_4_ = fVar183 * fVar203;
    auVar144._12_4_ = fVar156 * fVar205;
    fVar164 = auVar45._0_4_;
    auVar151._0_4_ = fVar164 * fVar208;
    fVar165 = auVar45._4_4_;
    auVar151._4_4_ = fVar165 * fVar192;
    auVar151._8_4_ = fVar164 * fVar203;
    auVar151._12_4_ = fVar165 * fVar205;
    fVar204 = auVar46._0_4_;
    auVar120._0_4_ = fVar204 * fVar208;
    fVar206 = auVar46._4_4_;
    auVar120._4_4_ = fVar206 * fVar192;
    auVar120._8_4_ = fVar204 * fVar203;
    auVar120._12_4_ = fVar206 * fVar205;
    auVar39 = vfmadd231ps_avx512vl(auVar135,auVar41,auVar37);
    auVar49 = vfmadd231ps_avx512vl(auVar144,auVar41,auVar48);
    auVar40 = vfmadd231ps_fma(auVar151,auVar41,auVar168);
    auVar41 = vfmadd231ps_fma(auVar120,auVar174,auVar41);
    auVar50 = vmovshdup_avx(auVar36);
    fVar192 = auVar36._0_4_;
    fVar208 = (auVar50._0_4_ - fVar192) * 0.04761905;
    auVar78._4_4_ = fVar192;
    auVar78._0_4_ = fVar192;
    auVar78._8_4_ = fVar192;
    auVar78._12_4_ = fVar192;
    auVar78._16_4_ = fVar192;
    auVar78._20_4_ = fVar192;
    auVar78._24_4_ = fVar192;
    auVar78._28_4_ = fVar192;
    auVar68._0_8_ = auVar50._0_8_;
    auVar68._8_8_ = auVar68._0_8_;
    auVar68._16_8_ = auVar68._0_8_;
    auVar68._24_8_ = auVar68._0_8_;
    auVar81 = vsubps_avx(auVar68,auVar78);
    uVar97 = auVar39._0_4_;
    auVar82._4_4_ = uVar97;
    auVar82._0_4_ = uVar97;
    auVar82._8_4_ = uVar97;
    auVar82._12_4_ = uVar97;
    auVar82._16_4_ = uVar97;
    auVar82._20_4_ = uVar97;
    auVar82._24_4_ = uVar97;
    auVar82._28_4_ = uVar97;
    auVar70._8_4_ = 1;
    auVar70._0_8_ = 0x100000001;
    auVar70._12_4_ = 1;
    auVar70._16_4_ = 1;
    auVar70._20_4_ = 1;
    auVar70._24_4_ = 1;
    auVar70._28_4_ = 1;
    auVar80 = ZEXT1632(auVar39);
    auVar79 = vpermps_avx2(auVar70,auVar80);
    auVar64 = vbroadcastss_avx512vl(auVar49);
    auVar74 = ZEXT1632(auVar49);
    auVar65 = vpermps_avx512vl(auVar70,auVar74);
    auVar66 = vbroadcastss_avx512vl(auVar40);
    auVar75 = ZEXT1632(auVar40);
    auVar67 = vpermps_avx512vl(auVar70,auVar75);
    auVar68 = vbroadcastss_avx512vl(auVar41);
    auVar77 = ZEXT1632(auVar41);
    auVar69 = vpermps_avx512vl(auVar70,auVar77);
    auVar83._4_4_ = fVar208;
    auVar83._0_4_ = fVar208;
    auVar83._8_4_ = fVar208;
    auVar83._12_4_ = fVar208;
    auVar83._16_4_ = fVar208;
    auVar83._20_4_ = fVar208;
    auVar83._24_4_ = fVar208;
    auVar83._28_4_ = fVar208;
    auVar76._8_4_ = 2;
    auVar76._0_8_ = 0x200000002;
    auVar76._12_4_ = 2;
    auVar76._16_4_ = 2;
    auVar76._20_4_ = 2;
    auVar76._24_4_ = 2;
    auVar76._28_4_ = 2;
    auVar70 = vpermps_avx512vl(auVar76,auVar80);
    auVar71 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar72 = vpermps_avx512vl(auVar71,auVar80);
    auVar73 = vpermps_avx512vl(auVar76,auVar74);
    auVar74 = vpermps_avx512vl(auVar71,auVar74);
    auVar80 = vpermps_avx2(auVar76,auVar75);
    auVar75 = vpermps_avx512vl(auVar71,auVar75);
    auVar76 = vpermps_avx512vl(auVar76,auVar77);
    auVar71 = vpermps_avx512vl(auVar71,auVar77);
    auVar50 = vfmadd132ps_fma(auVar81,auVar78,_DAT_01faff20);
    auVar81 = vsubps_avx(auVar84,ZEXT1632(auVar50));
    auVar77 = vmulps_avx512vl(auVar64,ZEXT1632(auVar50));
    auVar84 = ZEXT1632(auVar50);
    auVar78 = vmulps_avx512vl(auVar65,auVar84);
    auVar41 = vfmadd231ps_fma(auVar77,auVar81,auVar82);
    auVar40 = vfmadd231ps_fma(auVar78,auVar81,auVar79);
    auVar77 = vmulps_avx512vl(auVar66,auVar84);
    auVar78 = vmulps_avx512vl(auVar67,auVar84);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar64);
    auVar78 = vfmadd231ps_avx512vl(auVar78,auVar81,auVar65);
    auVar64 = vmulps_avx512vl(auVar68,auVar84);
    auVar82 = ZEXT1632(auVar50);
    auVar65 = vmulps_avx512vl(auVar69,auVar82);
    auVar66 = vfmadd231ps_avx512vl(auVar64,auVar81,auVar66);
    auVar67 = vfmadd231ps_avx512vl(auVar65,auVar81,auVar67);
    fVar203 = auVar50._0_4_;
    fVar205 = auVar50._4_4_;
    auVar64._4_4_ = fVar205 * auVar77._4_4_;
    auVar64._0_4_ = fVar203 * auVar77._0_4_;
    fVar207 = auVar50._8_4_;
    auVar64._8_4_ = fVar207 * auVar77._8_4_;
    fVar191 = auVar50._12_4_;
    auVar64._12_4_ = fVar191 * auVar77._12_4_;
    auVar64._16_4_ = auVar77._16_4_ * 0.0;
    auVar64._20_4_ = auVar77._20_4_ * 0.0;
    auVar64._24_4_ = auVar77._24_4_ * 0.0;
    auVar64._28_4_ = fVar192;
    auVar65._4_4_ = fVar205 * auVar78._4_4_;
    auVar65._0_4_ = fVar203 * auVar78._0_4_;
    auVar65._8_4_ = fVar207 * auVar78._8_4_;
    auVar65._12_4_ = fVar191 * auVar78._12_4_;
    auVar65._16_4_ = auVar78._16_4_ * 0.0;
    auVar65._20_4_ = auVar78._20_4_ * 0.0;
    auVar65._24_4_ = auVar78._24_4_ * 0.0;
    auVar65._28_4_ = auVar79._28_4_;
    auVar41 = vfmadd231ps_fma(auVar64,auVar81,ZEXT1632(auVar41));
    auVar40 = vfmadd231ps_fma(auVar65,auVar81,ZEXT1632(auVar40));
    auVar69._0_4_ = fVar203 * auVar66._0_4_;
    auVar69._4_4_ = fVar205 * auVar66._4_4_;
    auVar69._8_4_ = fVar207 * auVar66._8_4_;
    auVar69._12_4_ = fVar191 * auVar66._12_4_;
    auVar69._16_4_ = auVar66._16_4_ * 0.0;
    auVar69._20_4_ = auVar66._20_4_ * 0.0;
    auVar69._24_4_ = auVar66._24_4_ * 0.0;
    auVar69._28_4_ = 0;
    auVar79._4_4_ = fVar205 * auVar67._4_4_;
    auVar79._0_4_ = fVar203 * auVar67._0_4_;
    auVar79._8_4_ = fVar207 * auVar67._8_4_;
    auVar79._12_4_ = fVar191 * auVar67._12_4_;
    auVar79._16_4_ = auVar67._16_4_ * 0.0;
    auVar79._20_4_ = auVar67._20_4_ * 0.0;
    auVar79._24_4_ = auVar67._24_4_ * 0.0;
    auVar79._28_4_ = auVar66._28_4_;
    auVar39 = vfmadd231ps_fma(auVar69,auVar81,auVar77);
    auVar49 = vfmadd231ps_fma(auVar79,auVar81,auVar78);
    auVar66._28_4_ = auVar78._28_4_;
    auVar66._0_28_ =
         ZEXT1628(CONCAT412(fVar191 * auVar49._12_4_,
                            CONCAT48(fVar207 * auVar49._8_4_,
                                     CONCAT44(fVar205 * auVar49._4_4_,fVar203 * auVar49._0_4_))));
    auVar58 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar191 * auVar39._12_4_,
                                                 CONCAT48(fVar207 * auVar39._8_4_,
                                                          CONCAT44(fVar205 * auVar39._4_4_,
                                                                   fVar203 * auVar39._0_4_)))),
                              auVar81,ZEXT1632(auVar41));
    auVar60 = vfmadd231ps_fma(auVar66,auVar81,ZEXT1632(auVar40));
    auVar79 = vsubps_avx(ZEXT1632(auVar39),ZEXT1632(auVar41));
    auVar64 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar40));
    auVar65 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar79 = vmulps_avx512vl(auVar79,auVar65);
    auVar64 = vmulps_avx512vl(auVar64,auVar65);
    auVar77._0_4_ = fVar208 * auVar79._0_4_;
    auVar77._4_4_ = fVar208 * auVar79._4_4_;
    auVar77._8_4_ = fVar208 * auVar79._8_4_;
    auVar77._12_4_ = fVar208 * auVar79._12_4_;
    auVar77._16_4_ = fVar208 * auVar79._16_4_;
    auVar77._20_4_ = fVar208 * auVar79._20_4_;
    auVar77._24_4_ = fVar208 * auVar79._24_4_;
    auVar77._28_4_ = 0;
    auVar79 = vmulps_avx512vl(auVar83,auVar64);
    auVar40 = vxorps_avx512vl(auVar68._0_16_,auVar68._0_16_);
    auVar64 = vpermt2ps_avx512vl(ZEXT1632(auVar58),_DAT_01feed00,ZEXT1632(auVar40));
    auVar66 = vpermt2ps_avx512vl(ZEXT1632(auVar60),_DAT_01feed00,ZEXT1632(auVar40));
    auVar125._0_4_ = auVar77._0_4_ + auVar58._0_4_;
    auVar125._4_4_ = auVar77._4_4_ + auVar58._4_4_;
    auVar125._8_4_ = auVar77._8_4_ + auVar58._8_4_;
    auVar125._12_4_ = auVar77._12_4_ + auVar58._12_4_;
    auVar125._16_4_ = auVar77._16_4_ + 0.0;
    auVar125._20_4_ = auVar77._20_4_ + 0.0;
    auVar125._24_4_ = auVar77._24_4_ + 0.0;
    auVar125._28_4_ = 0;
    auVar78 = ZEXT1632(auVar40);
    auVar67 = vpermt2ps_avx512vl(auVar77,_DAT_01feed00,auVar78);
    auVar68 = vaddps_avx512vl(ZEXT1632(auVar60),auVar79);
    auVar69 = vpermt2ps_avx512vl(auVar79,_DAT_01feed00,auVar78);
    auVar79 = vsubps_avx(auVar64,auVar67);
    auVar69 = vsubps_avx512vl(auVar66,auVar69);
    auVar67 = vmulps_avx512vl(auVar73,auVar82);
    auVar77 = vmulps_avx512vl(auVar74,auVar82);
    auVar67 = vfmadd231ps_avx512vl(auVar67,auVar81,auVar70);
    auVar70 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar72);
    auVar72 = vmulps_avx512vl(auVar80,auVar82);
    auVar77 = vmulps_avx512vl(auVar75,auVar82);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar81,auVar73);
    auVar73 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar74);
    auVar74 = vmulps_avx512vl(auVar76,auVar82);
    auVar71 = vmulps_avx512vl(auVar71,auVar82);
    auVar41 = vfmadd231ps_fma(auVar74,auVar81,auVar80);
    auVar80 = vfmadd231ps_avx512vl(auVar71,auVar81,auVar75);
    auVar71 = vmulps_avx512vl(auVar82,auVar72);
    auVar76 = ZEXT1632(auVar50);
    auVar74 = vmulps_avx512vl(auVar76,auVar73);
    auVar67 = vfmadd231ps_avx512vl(auVar71,auVar81,auVar67);
    auVar70 = vfmadd231ps_avx512vl(auVar74,auVar81,auVar70);
    auVar80 = vmulps_avx512vl(auVar76,auVar80);
    auVar71 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar191 * auVar41._12_4_,
                                            CONCAT48(fVar207 * auVar41._8_4_,
                                                     CONCAT44(fVar205 * auVar41._4_4_,
                                                              fVar203 * auVar41._0_4_)))),auVar81,
                         auVar72);
    auVar72 = vfmadd231ps_avx512vl(auVar80,auVar81,auVar73);
    auVar80._4_4_ = fVar205 * auVar71._4_4_;
    auVar80._0_4_ = fVar203 * auVar71._0_4_;
    auVar80._8_4_ = fVar207 * auVar71._8_4_;
    auVar80._12_4_ = fVar191 * auVar71._12_4_;
    auVar80._16_4_ = auVar71._16_4_ * 0.0;
    auVar80._20_4_ = auVar71._20_4_ * 0.0;
    auVar80._24_4_ = auVar71._24_4_ * 0.0;
    auVar80._28_4_ = auVar75._28_4_;
    auVar73 = vmulps_avx512vl(auVar76,auVar72);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar81,auVar67);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar70,auVar81);
    auVar81 = vsubps_avx512vl(auVar71,auVar67);
    auVar67 = vsubps_avx512vl(auVar72,auVar70);
    auVar70 = vmulps_avx512vl(auVar81,auVar65);
    auVar65 = vmulps_avx512vl(auVar67,auVar65);
    fVar192 = fVar208 * auVar70._0_4_;
    fVar203 = fVar208 * auVar70._4_4_;
    auVar81._4_4_ = fVar203;
    auVar81._0_4_ = fVar192;
    fVar205 = fVar208 * auVar70._8_4_;
    auVar81._8_4_ = fVar205;
    fVar207 = fVar208 * auVar70._12_4_;
    auVar81._12_4_ = fVar207;
    fVar191 = fVar208 * auVar70._16_4_;
    auVar81._16_4_ = fVar191;
    fVar202 = fVar208 * auVar70._20_4_;
    auVar81._20_4_ = fVar202;
    fVar208 = fVar208 * auVar70._24_4_;
    auVar81._24_4_ = fVar208;
    auVar81._28_4_ = auVar70._28_4_;
    auVar65 = vmulps_avx512vl(auVar83,auVar65);
    auVar71 = vpermt2ps_avx512vl(auVar80,_DAT_01feed00,auVar78);
    auVar72 = vpermt2ps_avx512vl(auVar73,_DAT_01feed00,auVar78);
    auVar190._0_4_ = auVar80._0_4_ + fVar192;
    auVar190._4_4_ = auVar80._4_4_ + fVar203;
    auVar190._8_4_ = auVar80._8_4_ + fVar205;
    auVar190._12_4_ = auVar80._12_4_ + fVar207;
    auVar190._16_4_ = auVar80._16_4_ + fVar191;
    auVar190._20_4_ = auVar80._20_4_ + fVar202;
    auVar190._24_4_ = auVar80._24_4_ + fVar208;
    auVar190._28_4_ = auVar80._28_4_ + auVar70._28_4_;
    auVar81 = vpermt2ps_avx512vl(auVar81,_DAT_01feed00,ZEXT1632(auVar40));
    auVar70 = vaddps_avx512vl(auVar73,auVar65);
    auVar65 = vpermt2ps_avx512vl(auVar65,_DAT_01feed00,ZEXT1632(auVar40));
    auVar81 = vsubps_avx(auVar71,auVar81);
    auVar65 = vsubps_avx512vl(auVar72,auVar65);
    auVar85 = ZEXT1632(auVar58);
    auVar67 = vsubps_avx512vl(auVar80,auVar85);
    auVar87 = ZEXT1632(auVar60);
    auVar74 = vsubps_avx512vl(auVar73,auVar87);
    auVar75 = vsubps_avx512vl(auVar71,auVar64);
    auVar67 = vaddps_avx512vl(auVar67,auVar75);
    auVar75 = vsubps_avx512vl(auVar72,auVar66);
    auVar74 = vaddps_avx512vl(auVar74,auVar75);
    auVar75 = vmulps_avx512vl(auVar87,auVar67);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar85,auVar74);
    auVar76 = vmulps_avx512vl(auVar68,auVar67);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar125,auVar74);
    auVar77 = vmulps_avx512vl(auVar69,auVar67);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar79,auVar74);
    auVar78 = vmulps_avx512vl(auVar66,auVar67);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar64,auVar74);
    auVar82 = vmulps_avx512vl(auVar73,auVar67);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar80,auVar74);
    auVar83 = vmulps_avx512vl(auVar70,auVar67);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar190,auVar74);
    auVar84 = vmulps_avx512vl(auVar65,auVar67);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar81,auVar74);
    auVar67 = vmulps_avx512vl(auVar72,auVar67);
    auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar71,auVar74);
    auVar74 = vminps_avx512vl(auVar75,auVar76);
    auVar75 = vmaxps_avx512vl(auVar75,auVar76);
    auVar76 = vminps_avx512vl(auVar77,auVar78);
    auVar74 = vminps_avx512vl(auVar74,auVar76);
    auVar76 = vmaxps_avx512vl(auVar77,auVar78);
    auVar75 = vmaxps_avx512vl(auVar75,auVar76);
    auVar76 = vminps_avx512vl(auVar82,auVar83);
    auVar77 = vmaxps_avx512vl(auVar82,auVar83);
    auVar78 = vminps_avx512vl(auVar84,auVar67);
    auVar76 = vminps_avx512vl(auVar76,auVar78);
    auVar74 = vminps_avx512vl(auVar74,auVar76);
    auVar67 = vmaxps_avx512vl(auVar84,auVar67);
    auVar67 = vmaxps_avx512vl(auVar77,auVar67);
    auVar75 = vmaxps_avx512vl(auVar75,auVar67);
    uVar15 = vcmpps_avx512vl(auVar74,local_260,2);
    auVar67._4_4_ = uStack_1bc;
    auVar67._0_4_ = local_1c0;
    auVar67._8_4_ = uStack_1b8;
    auVar67._12_4_ = uStack_1b4;
    auVar67._16_4_ = uStack_1b0;
    auVar67._20_4_ = uStack_1ac;
    auVar67._24_4_ = uStack_1a8;
    auVar67._28_4_ = uStack_1a4;
    uVar16 = vcmpps_avx512vl(auVar75,auVar67,5);
    bVar27 = (byte)uVar15 & (byte)uVar16 & 0x7f;
    if (bVar27 != 0) {
      auVar74 = vsubps_avx512vl(auVar64,auVar85);
      auVar75 = vsubps_avx512vl(auVar66,auVar87);
      auVar76 = vsubps_avx512vl(auVar71,auVar80);
      auVar74 = vaddps_avx512vl(auVar74,auVar76);
      auVar76 = vsubps_avx512vl(auVar72,auVar73);
      auVar75 = vaddps_avx512vl(auVar75,auVar76);
      auVar76 = vmulps_avx512vl(auVar87,auVar74);
      auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar75,auVar85);
      auVar68 = vmulps_avx512vl(auVar68,auVar74);
      auVar68 = vfnmadd213ps_avx512vl(auVar125,auVar75,auVar68);
      auVar69 = vmulps_avx512vl(auVar69,auVar74);
      auVar69 = vfnmadd213ps_avx512vl(auVar79,auVar75,auVar69);
      auVar79 = vmulps_avx512vl(auVar66,auVar74);
      auVar66 = vfnmadd231ps_avx512vl(auVar79,auVar75,auVar64);
      auVar79 = vmulps_avx512vl(auVar73,auVar74);
      auVar73 = vfnmadd231ps_avx512vl(auVar79,auVar75,auVar80);
      auVar79 = vmulps_avx512vl(auVar70,auVar74);
      auVar70 = vfnmadd213ps_avx512vl(auVar190,auVar75,auVar79);
      auVar79 = vmulps_avx512vl(auVar65,auVar74);
      auVar77 = vfnmadd213ps_avx512vl(auVar81,auVar75,auVar79);
      auVar81 = vmulps_avx512vl(auVar72,auVar74);
      auVar71 = vfnmadd231ps_avx512vl(auVar81,auVar71,auVar75);
      auVar79 = vminps_avx(auVar76,auVar68);
      auVar81 = vmaxps_avx(auVar76,auVar68);
      auVar64 = vminps_avx(auVar69,auVar66);
      auVar64 = vminps_avx(auVar79,auVar64);
      auVar79 = vmaxps_avx(auVar69,auVar66);
      auVar81 = vmaxps_avx(auVar81,auVar79);
      auVar80 = vminps_avx(auVar73,auVar70);
      auVar79 = vmaxps_avx(auVar73,auVar70);
      auVar65 = vminps_avx(auVar77,auVar71);
      auVar80 = vminps_avx(auVar80,auVar65);
      auVar80 = vminps_avx(auVar64,auVar80);
      auVar64 = vmaxps_avx(auVar77,auVar71);
      auVar79 = vmaxps_avx(auVar79,auVar64);
      auVar81 = vmaxps_avx(auVar81,auVar79);
      uVar15 = vcmpps_avx512vl(auVar81,auVar67,5);
      uVar16 = vcmpps_avx512vl(auVar80,local_260,2);
      bVar27 = bVar27 & (byte)uVar15 & (byte)uVar16;
      if (bVar27 != 0) {
        auStack_440[uVar22] = (uint)bVar27;
        uVar15 = vmovlps_avx(auVar36);
        (&uStack_240)[uVar22] = uVar15;
        uVar24 = vmovlps_avx(auVar108);
        auStack_1a0[uVar22] = uVar24;
        uVar22 = (ulong)((int)uVar22 + 1);
      }
    }
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar234 = ZEXT1664(auVar36);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar235 = ZEXT1664(auVar36);
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar236 = ZEXT3264(auVar81);
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar237 = ZEXT1664(auVar36);
    auVar238 = ZEXT3264(_DAT_01feed20);
LAB_01ab11bb:
    do {
      do {
        if ((int)uVar22 == 0) {
          if (bVar21) {
            return bVar21;
          }
          uVar97 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar20._4_4_ = uVar97;
          auVar20._0_4_ = uVar97;
          auVar20._8_4_ = uVar97;
          auVar20._12_4_ = uVar97;
          uVar15 = vcmpps_avx512vl(local_3a0,auVar20,2);
          uVar30 = (uint)uVar35 & local_468 & (uint)uVar15;
          uVar35 = (ulong)uVar30;
          if (uVar30 == 0) {
            return bVar21;
          }
          goto LAB_01ab05bf;
        }
        uVar28 = (int)uVar22 - 1;
        uVar29 = (ulong)uVar28;
        uVar5 = auStack_440[uVar29];
        auVar108._8_8_ = 0;
        auVar108._0_8_ = auStack_1a0[uVar29];
        uVar24 = 0;
        for (uVar25 = (ulong)uVar5; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
          uVar24 = uVar24 + 1;
        }
        uVar23 = uVar5 - 1 & uVar5;
        bVar33 = uVar23 == 0;
        auStack_440[uVar29] = uVar23;
        if (bVar33) {
          uVar22 = (ulong)uVar28;
        }
        auVar102._8_8_ = 0;
        auVar102._0_8_ = uVar24;
        auVar36 = vpunpcklqdq_avx(auVar102,ZEXT416((int)uVar24 + 1));
        auVar36 = vcvtqq2ps_avx512vl(auVar36);
        auVar36 = vmulps_avx512vl(auVar36,auVar237._0_16_);
        uVar97 = *(undefined4 *)((long)&uStack_240 + uVar29 * 8 + 4);
        auVar17._4_4_ = uVar97;
        auVar17._0_4_ = uVar97;
        auVar17._8_4_ = uVar97;
        auVar17._12_4_ = uVar97;
        auVar50 = vmulps_avx512vl(auVar36,auVar17);
        auVar41 = auVar240._0_16_;
        auVar36 = vsubps_avx512vl(auVar41,auVar36);
        uVar97 = *(undefined4 *)(&uStack_240 + uVar29);
        auVar18._4_4_ = uVar97;
        auVar18._0_4_ = uVar97;
        auVar18._8_4_ = uVar97;
        auVar18._12_4_ = uVar97;
        auVar36 = vfmadd231ps_avx512vl(auVar50,auVar36,auVar18);
        auVar50 = vmovshdup_avx(auVar36);
        fVar208 = auVar50._0_4_ - auVar36._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar208));
        if (uVar5 == 0 || bVar33) goto LAB_01ab0cb2;
        auVar50 = vshufps_avx(auVar108,auVar108,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar208));
        auVar49 = vsubps_avx512vl(auVar41,auVar50);
        fVar192 = auVar50._0_4_;
        auVar145._0_4_ = fVar192 * fVar130;
        fVar203 = auVar50._4_4_;
        auVar145._4_4_ = fVar203 * fVar139;
        fVar205 = auVar50._8_4_;
        auVar145._8_4_ = fVar205 * fVar130;
        fVar207 = auVar50._12_4_;
        auVar145._12_4_ = fVar207 * fVar139;
        auVar152._0_4_ = fVar192 * fVar183;
        auVar152._4_4_ = fVar203 * fVar156;
        auVar152._8_4_ = fVar205 * fVar183;
        auVar152._12_4_ = fVar207 * fVar156;
        auVar158._0_4_ = fVar192 * fVar164;
        auVar158._4_4_ = fVar203 * fVar165;
        auVar158._8_4_ = fVar205 * fVar164;
        auVar158._12_4_ = fVar207 * fVar165;
        auVar126._0_4_ = fVar192 * fVar204;
        auVar126._4_4_ = fVar203 * fVar206;
        auVar126._8_4_ = fVar205 * fVar204;
        auVar126._12_4_ = fVar207 * fVar206;
        auVar50 = vfmadd231ps_fma(auVar145,auVar49,auVar37);
        auVar40 = vfmadd231ps_fma(auVar152,auVar49,auVar48);
        auVar39 = vfmadd231ps_fma(auVar158,auVar49,auVar168);
        auVar49 = vfmadd231ps_fma(auVar126,auVar49,auVar174);
        auVar72._16_16_ = auVar50;
        auVar72._0_16_ = auVar50;
        auVar73._16_16_ = auVar40;
        auVar73._0_16_ = auVar40;
        auVar75._16_16_ = auVar39;
        auVar75._0_16_ = auVar39;
        auVar79 = vpermps_avx512vl(auVar238._0_32_,ZEXT1632(auVar36));
        auVar81 = vsubps_avx(auVar73,auVar72);
        auVar40 = vfmadd213ps_fma(auVar81,auVar79,auVar72);
        auVar81 = vsubps_avx(auVar75,auVar73);
        auVar58 = vfmadd213ps_fma(auVar81,auVar79,auVar73);
        auVar50 = vsubps_avx(auVar49,auVar39);
        auVar74._16_16_ = auVar50;
        auVar74._0_16_ = auVar50;
        auVar50 = vfmadd213ps_fma(auVar74,auVar79,auVar75);
        auVar81 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar40));
        auVar40 = vfmadd213ps_fma(auVar81,auVar79,ZEXT1632(auVar40));
        auVar81 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar58));
        auVar50 = vfmadd213ps_fma(auVar81,auVar79,ZEXT1632(auVar58));
        auVar81 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar40));
        auVar63 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar81,auVar79);
        auVar81 = vmulps_avx512vl(auVar81,auVar236._0_32_);
        auVar71._16_16_ = auVar81._16_16_;
        auVar50 = vmulss_avx512f(ZEXT416((uint)fVar208),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar192 = auVar50._0_4_;
        auVar159._0_8_ =
             CONCAT44(auVar63._4_4_ + fVar192 * auVar81._4_4_,
                      auVar63._0_4_ + fVar192 * auVar81._0_4_);
        auVar159._8_4_ = auVar63._8_4_ + fVar192 * auVar81._8_4_;
        auVar159._12_4_ = auVar63._12_4_ + fVar192 * auVar81._12_4_;
        auVar146._0_4_ = fVar192 * auVar81._16_4_;
        auVar146._4_4_ = fVar192 * auVar81._20_4_;
        auVar146._8_4_ = fVar192 * auVar81._24_4_;
        auVar146._12_4_ = fVar192 * auVar81._28_4_;
        auVar57 = vsubps_avx((undefined1  [16])0x0,auVar146);
        auVar58 = vshufpd_avx(auVar63,auVar63,3);
        auVar60 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar50 = vsubps_avx(auVar58,auVar63);
        auVar40 = vsubps_avx(auVar60,(undefined1  [16])0x0);
        auVar175._0_4_ = auVar50._0_4_ + auVar40._0_4_;
        auVar175._4_4_ = auVar50._4_4_ + auVar40._4_4_;
        auVar175._8_4_ = auVar50._8_4_ + auVar40._8_4_;
        auVar175._12_4_ = auVar50._12_4_ + auVar40._12_4_;
        auVar50 = vshufps_avx(auVar63,auVar63,0xb1);
        auVar40 = vshufps_avx(auVar159,auVar159,0xb1);
        auVar39 = vshufps_avx(auVar57,auVar57,0xb1);
        auVar49 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar226._4_4_ = auVar175._0_4_;
        auVar226._0_4_ = auVar175._0_4_;
        auVar226._8_4_ = auVar175._0_4_;
        auVar226._12_4_ = auVar175._0_4_;
        auVar53 = vshufps_avx(auVar175,auVar175,0x55);
        fVar192 = auVar53._0_4_;
        auVar188._0_4_ = auVar50._0_4_ * fVar192;
        fVar203 = auVar53._4_4_;
        auVar188._4_4_ = auVar50._4_4_ * fVar203;
        fVar205 = auVar53._8_4_;
        auVar188._8_4_ = auVar50._8_4_ * fVar205;
        fVar207 = auVar53._12_4_;
        auVar188._12_4_ = auVar50._12_4_ * fVar207;
        auVar194._0_4_ = auVar40._0_4_ * fVar192;
        auVar194._4_4_ = auVar40._4_4_ * fVar203;
        auVar194._8_4_ = auVar40._8_4_ * fVar205;
        auVar194._12_4_ = auVar40._12_4_ * fVar207;
        auVar212._0_4_ = auVar39._0_4_ * fVar192;
        auVar212._4_4_ = auVar39._4_4_ * fVar203;
        auVar212._8_4_ = auVar39._8_4_ * fVar205;
        auVar212._12_4_ = auVar39._12_4_ * fVar207;
        auVar176._0_4_ = auVar49._0_4_ * fVar192;
        auVar176._4_4_ = auVar49._4_4_ * fVar203;
        auVar176._8_4_ = auVar49._8_4_ * fVar205;
        auVar176._12_4_ = auVar49._12_4_ * fVar207;
        auVar50 = vfmadd231ps_fma(auVar188,auVar226,auVar63);
        auVar40 = vfmadd231ps_fma(auVar194,auVar226,auVar159);
        auVar55 = vfmadd231ps_fma(auVar212,auVar226,auVar57);
        auVar56 = vfmadd231ps_fma(auVar176,(undefined1  [16])0x0,auVar226);
        auVar53 = vshufpd_avx(auVar50,auVar50,1);
        auVar54 = vshufpd_avx(auVar40,auVar40,1);
        auVar51 = vshufpd_avx512vl(auVar55,auVar55,1);
        auVar52 = vshufpd_avx512vl(auVar56,auVar56,1);
        auVar39 = vminss_avx(auVar50,auVar40);
        auVar50 = vmaxss_avx(auVar40,auVar50);
        auVar49 = vminss_avx(auVar55,auVar56);
        auVar40 = vmaxss_avx(auVar56,auVar55);
        auVar39 = vminss_avx(auVar39,auVar49);
        auVar50 = vmaxss_avx(auVar40,auVar50);
        auVar49 = vminss_avx(auVar53,auVar54);
        auVar40 = vmaxss_avx(auVar54,auVar53);
        auVar53 = vminss_avx512f(auVar51,auVar52);
        auVar54 = vmaxss_avx512f(auVar52,auVar51);
        auVar40 = vmaxss_avx(auVar54,auVar40);
        auVar49 = vminss_avx512f(auVar49,auVar53);
        vucomiss_avx512f(auVar39);
        fVar203 = auVar40._0_4_;
        fVar192 = auVar50._0_4_;
        if (4 < (uint)uVar22) {
          bVar34 = fVar203 == -0.0001;
          bVar31 = NAN(fVar203);
          if (fVar203 <= -0.0001) goto LAB_01ab13de;
          break;
        }
LAB_01ab13de:
        auVar53 = vucomiss_avx512f(auVar49);
        bVar34 = fVar203 <= -0.0001;
        bVar32 = -0.0001 < fVar192;
        bVar31 = bVar34;
        if (!bVar34) break;
        uVar24 = vcmpps_avx512vl(auVar39,auVar53,5);
        uVar25 = vcmpps_avx512vl(auVar49,auVar53,5);
        bVar10 = (uVar24 & uVar25 & 1) == 0;
        bVar34 = bVar32 && bVar10;
        bVar31 = bVar32 && (uVar24 & uVar25 & 1) == 0;
      } while (!bVar32 || !bVar10);
      auVar55 = auVar241._0_16_;
      vcmpss_avx512f(auVar39,auVar55,1);
      uVar15 = vcmpss_avx512f(auVar50,auVar55,1);
      bVar32 = (bool)((byte)uVar15 & 1);
      auVar71._0_16_ = auVar242._0_16_;
      auVar85._4_28_ = auVar71._4_28_;
      auVar85._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * auVar242._0_4_);
      vucomiss_avx512f(auVar85._0_16_);
      bVar31 = (bool)(!bVar34 | bVar31);
      bVar32 = bVar31 == false;
      auVar87._16_16_ = auVar71._16_16_;
      auVar87._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar86._4_28_ = auVar87._4_28_;
      auVar86._0_4_ = (uint)bVar31 * auVar241._0_4_ + (uint)!bVar31 * 0x7f800000;
      auVar54 = auVar86._0_16_;
      auVar89._16_16_ = auVar71._16_16_;
      auVar89._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar88._4_28_ = auVar89._4_28_;
      auVar88._0_4_ = (uint)bVar31 * auVar241._0_4_ + (uint)!bVar31 * -0x800000;
      auVar53 = auVar88._0_16_;
      uVar15 = vcmpss_avx512f(auVar49,auVar55,1);
      bVar34 = (bool)((byte)uVar15 & 1);
      auVar91._16_16_ = auVar71._16_16_;
      auVar91._0_16_ = auVar242._0_16_;
      auVar90._4_28_ = auVar91._4_28_;
      auVar90._0_4_ = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * auVar242._0_4_);
      vucomiss_avx512f(auVar90._0_16_);
      if ((bVar31) || (bVar32)) {
        auVar49 = vucomiss_avx512f(auVar39);
        if ((bVar31) || (bVar32)) {
          auVar56 = vxorps_avx512vl(auVar39,auVar235._0_16_);
          auVar39 = vsubss_avx512f(auVar49,auVar39);
          auVar39 = vdivss_avx512f(auVar56,auVar39);
          auVar49 = vsubss_avx512f(ZEXT416(0x3f800000),auVar39);
          auVar49 = vfmadd213ss_avx512f(auVar49,auVar55,auVar39);
          auVar39 = auVar49;
        }
        else {
          auVar39 = vxorps_avx512vl(auVar49,auVar49);
          vucomiss_avx512f(auVar39);
          auVar49 = ZEXT416(0x3f800000);
          if ((bVar31) || (bVar32)) {
            auVar49 = SUB6416(ZEXT464(0xff800000),0);
            auVar39 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar54 = vminss_avx512f(auVar54,auVar39);
        auVar53 = vmaxss_avx(auVar49,auVar53);
      }
      auVar242 = ZEXT464(0x3f800000);
      uVar15 = vcmpss_avx512f(auVar40,auVar55,1);
      bVar34 = (bool)((byte)uVar15 & 1);
      auVar40 = auVar242._0_16_;
      fVar205 = (float)((uint)bVar34 * -0x40800000 + (uint)!bVar34 * 0x3f800000);
      if ((auVar85._0_4_ != fVar205) || (NAN(auVar85._0_4_) || NAN(fVar205))) {
        if ((fVar203 != fVar192) || (NAN(fVar203) || NAN(fVar192))) {
          auVar50 = vxorps_avx512vl(auVar50,auVar235._0_16_);
          auVar177._0_4_ = auVar50._0_4_ / (fVar203 - fVar192);
          auVar177._4_12_ = auVar50._4_12_;
          auVar50 = vsubss_avx512f(auVar40,auVar177);
          auVar50 = vfmadd213ss_avx512f(auVar50,auVar55,auVar177);
          auVar39 = auVar50;
        }
        else if ((fVar192 != 0.0) ||
                (auVar50 = auVar40, auVar39 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar192))) {
          auVar50 = SUB6416(ZEXT464(0xff800000),0);
          auVar39 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar54 = vminss_avx(auVar54,auVar39);
        auVar53 = vmaxss_avx(auVar50,auVar53);
      }
      bVar34 = auVar90._0_4_ != fVar205;
      auVar50 = vminss_avx512f(auVar54,auVar40);
      auVar93._16_16_ = auVar71._16_16_;
      auVar93._0_16_ = auVar54;
      auVar92._4_28_ = auVar93._4_28_;
      auVar92._0_4_ = (uint)bVar34 * auVar50._0_4_ + (uint)!bVar34 * auVar54._0_4_;
      auVar50 = vmaxss_avx512f(auVar40,auVar53);
      auVar95._16_16_ = auVar71._16_16_;
      auVar95._0_16_ = auVar53;
      auVar94._4_28_ = auVar95._4_28_;
      auVar94._0_4_ = (uint)bVar34 * auVar50._0_4_ + (uint)!bVar34 * auVar53._0_4_;
      auVar50 = vmaxss_avx512f(auVar55,auVar92._0_16_);
      auVar39 = vminss_avx512f(auVar94._0_16_,auVar40);
    } while (auVar39._0_4_ < auVar50._0_4_);
    auVar55 = vmaxss_avx512f(auVar55,ZEXT416((uint)(auVar50._0_4_ + -0.1)));
    auVar56 = vminss_avx512f(ZEXT416((uint)(auVar39._0_4_ + 0.1)),auVar40);
    auVar127._0_8_ = auVar63._0_8_;
    auVar127._8_8_ = auVar127._0_8_;
    auVar195._8_8_ = auVar159._0_8_;
    auVar195._0_8_ = auVar159._0_8_;
    auVar213._8_8_ = auVar57._0_8_;
    auVar213._0_8_ = auVar57._0_8_;
    auVar50 = vshufpd_avx(auVar159,auVar159,3);
    auVar39 = vshufpd_avx(auVar57,auVar57,3);
    auVar49 = vshufps_avx(auVar55,auVar56,0);
    auVar57 = vsubps_avx512vl(auVar41,auVar49);
    fVar192 = auVar49._0_4_;
    auVar153._0_4_ = fVar192 * auVar58._0_4_;
    fVar203 = auVar49._4_4_;
    auVar153._4_4_ = fVar203 * auVar58._4_4_;
    fVar205 = auVar49._8_4_;
    auVar153._8_4_ = fVar205 * auVar58._8_4_;
    fVar207 = auVar49._12_4_;
    auVar153._12_4_ = fVar207 * auVar58._12_4_;
    auVar160._0_4_ = fVar192 * auVar50._0_4_;
    auVar160._4_4_ = fVar203 * auVar50._4_4_;
    auVar160._8_4_ = fVar205 * auVar50._8_4_;
    auVar160._12_4_ = fVar207 * auVar50._12_4_;
    auVar229._0_4_ = auVar39._0_4_ * fVar192;
    auVar229._4_4_ = auVar39._4_4_ * fVar203;
    auVar229._8_4_ = auVar39._8_4_ * fVar205;
    auVar229._12_4_ = auVar39._12_4_ * fVar207;
    auVar147._0_4_ = fVar192 * auVar60._0_4_;
    auVar147._4_4_ = fVar203 * auVar60._4_4_;
    auVar147._8_4_ = fVar205 * auVar60._8_4_;
    auVar147._12_4_ = fVar207 * auVar60._12_4_;
    auVar60 = vfmadd231ps_fma(auVar153,auVar57,auVar127);
    auVar53 = vfmadd231ps_fma(auVar160,auVar57,auVar195);
    auVar54 = vfmadd231ps_fma(auVar229,auVar57,auVar213);
    auVar57 = vfmadd231ps_fma(auVar147,auVar57,ZEXT816(0));
    auVar39 = vsubss_avx512f(auVar40,auVar55);
    auVar50 = vmovshdup_avx(auVar108);
    auVar51 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar55._0_4_)),auVar108,auVar39);
    auVar39 = vsubss_avx512f(auVar40,auVar56);
    auVar52 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * auVar56._0_4_)),auVar108,auVar39);
    auVar55 = vdivss_avx512f(auVar40,ZEXT416((uint)fVar208));
    auVar50 = vsubps_avx(auVar53,auVar60);
    auVar228 = auVar234._0_16_;
    auVar49 = vmulps_avx512vl(auVar50,auVar228);
    auVar50 = vsubps_avx(auVar54,auVar53);
    auVar58 = vmulps_avx512vl(auVar50,auVar228);
    auVar50 = vsubps_avx(auVar57,auVar54);
    auVar50 = vmulps_avx512vl(auVar50,auVar228);
    auVar39 = vminps_avx(auVar58,auVar50);
    auVar50 = vmaxps_avx(auVar58,auVar50);
    auVar39 = vminps_avx(auVar49,auVar39);
    auVar50 = vmaxps_avx(auVar49,auVar50);
    auVar49 = vshufpd_avx(auVar39,auVar39,3);
    auVar58 = vshufpd_avx(auVar50,auVar50,3);
    auVar39 = vminps_avx(auVar39,auVar49);
    auVar50 = vmaxps_avx(auVar50,auVar58);
    fVar208 = auVar55._0_4_;
    auVar178._0_4_ = auVar39._0_4_ * fVar208;
    auVar178._4_4_ = auVar39._4_4_ * fVar208;
    auVar178._8_4_ = auVar39._8_4_ * fVar208;
    auVar178._12_4_ = auVar39._12_4_ * fVar208;
    auVar169._0_4_ = fVar208 * auVar50._0_4_;
    auVar169._4_4_ = fVar208 * auVar50._4_4_;
    auVar169._8_4_ = fVar208 * auVar50._8_4_;
    auVar169._12_4_ = fVar208 * auVar50._12_4_;
    auVar55 = vdivss_avx512f(auVar40,ZEXT416((uint)(auVar52._0_4_ - auVar51._0_4_)));
    auVar50 = vshufpd_avx(auVar60,auVar60,3);
    auVar39 = vshufpd_avx(auVar53,auVar53,3);
    auVar49 = vshufpd_avx(auVar54,auVar54,3);
    auVar58 = vshufpd_avx(auVar57,auVar57,3);
    auVar50 = vsubps_avx(auVar50,auVar60);
    auVar60 = vsubps_avx(auVar39,auVar53);
    auVar53 = vsubps_avx(auVar49,auVar54);
    auVar58 = vsubps_avx(auVar58,auVar57);
    auVar39 = vminps_avx(auVar50,auVar60);
    auVar50 = vmaxps_avx(auVar50,auVar60);
    auVar49 = vminps_avx(auVar53,auVar58);
    auVar49 = vminps_avx(auVar39,auVar49);
    auVar39 = vmaxps_avx(auVar53,auVar58);
    auVar50 = vmaxps_avx(auVar50,auVar39);
    fVar208 = auVar55._0_4_;
    auVar214._0_4_ = fVar208 * auVar49._0_4_;
    auVar214._4_4_ = fVar208 * auVar49._4_4_;
    auVar214._8_4_ = fVar208 * auVar49._8_4_;
    auVar214._12_4_ = fVar208 * auVar49._12_4_;
    auVar196._0_4_ = fVar208 * auVar50._0_4_;
    auVar196._4_4_ = fVar208 * auVar50._4_4_;
    auVar196._8_4_ = fVar208 * auVar50._8_4_;
    auVar196._12_4_ = fVar208 * auVar50._12_4_;
    auVar58 = vinsertps_avx(auVar36,auVar51,0x10);
    auVar59 = vpermt2ps_avx512vl(auVar36,_DAT_01feecd0,auVar52);
    auVar109._0_4_ = auVar58._0_4_ + auVar59._0_4_;
    auVar109._4_4_ = auVar58._4_4_ + auVar59._4_4_;
    auVar109._8_4_ = auVar58._8_4_ + auVar59._8_4_;
    auVar109._12_4_ = auVar58._12_4_ + auVar59._12_4_;
    auVar19._8_4_ = 0x3f000000;
    auVar19._0_8_ = 0x3f0000003f000000;
    auVar19._12_4_ = 0x3f000000;
    auVar55 = vmulps_avx512vl(auVar109,auVar19);
    auVar39 = vshufps_avx(auVar55,auVar55,0x54);
    uVar97 = auVar55._0_4_;
    auVar121._4_4_ = uVar97;
    auVar121._0_4_ = uVar97;
    auVar121._8_4_ = uVar97;
    auVar121._12_4_ = uVar97;
    auVar49 = vfmadd213ps_fma(local_270,auVar121,auVar38);
    auVar60 = vfmadd213ps_fma(local_280,auVar121,auVar47);
    auVar53 = vfmadd213ps_fma(local_290,auVar121,auVar44);
    auVar50 = vsubps_avx(auVar60,auVar49);
    auVar49 = vfmadd213ps_fma(auVar50,auVar121,auVar49);
    auVar50 = vsubps_avx(auVar53,auVar60);
    auVar50 = vfmadd213ps_fma(auVar50,auVar121,auVar60);
    auVar50 = vsubps_avx(auVar50,auVar49);
    auVar49 = vfmadd231ps_fma(auVar49,auVar50,auVar121);
    auVar54 = vmulps_avx512vl(auVar50,auVar228);
    auVar222._8_8_ = auVar49._0_8_;
    auVar222._0_8_ = auVar49._0_8_;
    auVar50 = vshufpd_avx(auVar49,auVar49,3);
    auVar49 = vshufps_avx(auVar55,auVar55,0x55);
    auVar60 = vsubps_avx(auVar50,auVar222);
    auVar53 = vfmadd231ps_fma(auVar222,auVar49,auVar60);
    auVar230._8_8_ = auVar54._0_8_;
    auVar230._0_8_ = auVar54._0_8_;
    auVar50 = vshufpd_avx(auVar54,auVar54,3);
    auVar50 = vsubps_avx512vl(auVar50,auVar230);
    auVar50 = vfmadd213ps_avx512vl(auVar50,auVar49,auVar230);
    auVar122._0_8_ = auVar60._0_8_ ^ 0x8000000080000000;
    auVar122._8_4_ = auVar60._8_4_ ^ 0x80000000;
    auVar122._12_4_ = auVar60._12_4_ ^ 0x80000000;
    auVar49 = vmovshdup_avx512vl(auVar50);
    auVar231._0_8_ = auVar49._0_8_ ^ 0x8000000080000000;
    auVar231._8_4_ = auVar49._8_4_ ^ 0x80000000;
    auVar231._12_4_ = auVar49._12_4_ ^ 0x80000000;
    auVar54 = vmovshdup_avx512vl(auVar60);
    auVar57 = vpermt2ps_avx512vl(auVar231,ZEXT416(5),auVar60);
    auVar49 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar49._0_4_ * auVar60._0_4_)),auVar50,auVar54);
    auVar60 = vpermt2ps_avx512vl(auVar50,SUB6416(ZEXT464(4),0),auVar122);
    auVar148._0_4_ = auVar49._0_4_;
    auVar148._4_4_ = auVar148._0_4_;
    auVar148._8_4_ = auVar148._0_4_;
    auVar148._12_4_ = auVar148._0_4_;
    auVar50 = vdivps_avx(auVar57,auVar148);
    auVar61 = vdivps_avx512vl(auVar60,auVar148);
    fVar208 = auVar53._0_4_;
    auVar49 = vshufps_avx(auVar53,auVar53,0x55);
    auVar223._0_4_ = fVar208 * auVar50._0_4_ + auVar49._0_4_ * auVar61._0_4_;
    auVar223._4_4_ = fVar208 * auVar50._4_4_ + auVar49._4_4_ * auVar61._4_4_;
    auVar223._8_4_ = fVar208 * auVar50._8_4_ + auVar49._8_4_ * auVar61._8_4_;
    auVar223._12_4_ = fVar208 * auVar50._12_4_ + auVar49._12_4_ * auVar61._12_4_;
    auVar56 = vsubps_avx(auVar39,auVar223);
    auVar49 = vmovshdup_avx(auVar50);
    auVar39 = vinsertps_avx(auVar178,auVar214,0x1c);
    auVar232._0_4_ = auVar49._0_4_ * auVar39._0_4_;
    auVar232._4_4_ = auVar49._4_4_ * auVar39._4_4_;
    auVar232._8_4_ = auVar49._8_4_ * auVar39._8_4_;
    auVar232._12_4_ = auVar49._12_4_ * auVar39._12_4_;
    auVar63 = vinsertps_avx512f(auVar169,auVar196,0x1c);
    auVar49 = vmulps_avx512vl(auVar49,auVar63);
    auVar57 = vminps_avx512vl(auVar232,auVar49);
    auVar53 = vmaxps_avx(auVar49,auVar232);
    auVar54 = vmovshdup_avx(auVar61);
    auVar49 = vinsertps_avx(auVar214,auVar178,0x4c);
    auVar215._0_4_ = auVar54._0_4_ * auVar49._0_4_;
    auVar215._4_4_ = auVar54._4_4_ * auVar49._4_4_;
    auVar215._8_4_ = auVar54._8_4_ * auVar49._8_4_;
    auVar215._12_4_ = auVar54._12_4_ * auVar49._12_4_;
    auVar60 = vinsertps_avx(auVar196,auVar169,0x4c);
    auVar197._0_4_ = auVar54._0_4_ * auVar60._0_4_;
    auVar197._4_4_ = auVar54._4_4_ * auVar60._4_4_;
    auVar197._8_4_ = auVar54._8_4_ * auVar60._8_4_;
    auVar197._12_4_ = auVar54._12_4_ * auVar60._12_4_;
    auVar54 = vminps_avx(auVar215,auVar197);
    auVar57 = vaddps_avx512vl(auVar57,auVar54);
    auVar54 = vmaxps_avx(auVar197,auVar215);
    auVar198._0_4_ = auVar53._0_4_ + auVar54._0_4_;
    auVar198._4_4_ = auVar53._4_4_ + auVar54._4_4_;
    auVar198._8_4_ = auVar53._8_4_ + auVar54._8_4_;
    auVar198._12_4_ = auVar53._12_4_ + auVar54._12_4_;
    auVar216._8_8_ = 0x3f80000000000000;
    auVar216._0_8_ = 0x3f80000000000000;
    auVar53 = vsubps_avx(auVar216,auVar198);
    auVar54 = vsubps_avx(auVar216,auVar57);
    auVar57 = vsubps_avx(auVar58,auVar55);
    auVar55 = vsubps_avx(auVar59,auVar55);
    fVar207 = auVar57._0_4_;
    auVar233._0_4_ = fVar207 * auVar53._0_4_;
    fVar191 = auVar57._4_4_;
    auVar233._4_4_ = fVar191 * auVar53._4_4_;
    fVar202 = auVar57._8_4_;
    auVar233._8_4_ = fVar202 * auVar53._8_4_;
    fVar209 = auVar57._12_4_;
    auVar233._12_4_ = fVar209 * auVar53._12_4_;
    auVar62 = vbroadcastss_avx512vl(auVar50);
    auVar39 = vmulps_avx512vl(auVar62,auVar39);
    auVar63 = vmulps_avx512vl(auVar62,auVar63);
    auVar62 = vminps_avx512vl(auVar39,auVar63);
    auVar63 = vmaxps_avx512vl(auVar63,auVar39);
    auVar39 = vbroadcastss_avx512vl(auVar61);
    auVar49 = vmulps_avx512vl(auVar39,auVar49);
    auVar39 = vmulps_avx512vl(auVar39,auVar60);
    auVar60 = vminps_avx512vl(auVar49,auVar39);
    auVar60 = vaddps_avx512vl(auVar62,auVar60);
    auVar57 = vmulps_avx512vl(auVar57,auVar54);
    fVar208 = auVar55._0_4_;
    auVar199._0_4_ = fVar208 * auVar53._0_4_;
    fVar192 = auVar55._4_4_;
    auVar199._4_4_ = fVar192 * auVar53._4_4_;
    fVar203 = auVar55._8_4_;
    auVar199._8_4_ = fVar203 * auVar53._8_4_;
    fVar205 = auVar55._12_4_;
    auVar199._12_4_ = fVar205 * auVar53._12_4_;
    auVar217._0_4_ = fVar208 * auVar54._0_4_;
    auVar217._4_4_ = fVar192 * auVar54._4_4_;
    auVar217._8_4_ = fVar203 * auVar54._8_4_;
    auVar217._12_4_ = fVar205 * auVar54._12_4_;
    auVar39 = vmaxps_avx(auVar39,auVar49);
    auVar170._0_4_ = auVar63._0_4_ + auVar39._0_4_;
    auVar170._4_4_ = auVar63._4_4_ + auVar39._4_4_;
    auVar170._8_4_ = auVar63._8_4_ + auVar39._8_4_;
    auVar170._12_4_ = auVar63._12_4_ + auVar39._12_4_;
    auVar179._8_8_ = 0x3f800000;
    auVar179._0_8_ = 0x3f800000;
    auVar39 = vsubps_avx(auVar179,auVar170);
    auVar49 = vsubps_avx512vl(auVar179,auVar60);
    auVar227._0_4_ = fVar207 * auVar39._0_4_;
    auVar227._4_4_ = fVar191 * auVar39._4_4_;
    auVar227._8_4_ = fVar202 * auVar39._8_4_;
    auVar227._12_4_ = fVar209 * auVar39._12_4_;
    auVar224._0_4_ = fVar207 * auVar49._0_4_;
    auVar224._4_4_ = fVar191 * auVar49._4_4_;
    auVar224._8_4_ = fVar202 * auVar49._8_4_;
    auVar224._12_4_ = fVar209 * auVar49._12_4_;
    auVar171._0_4_ = fVar208 * auVar39._0_4_;
    auVar171._4_4_ = fVar192 * auVar39._4_4_;
    auVar171._8_4_ = fVar203 * auVar39._8_4_;
    auVar171._12_4_ = fVar205 * auVar39._12_4_;
    auVar180._0_4_ = fVar208 * auVar49._0_4_;
    auVar180._4_4_ = fVar192 * auVar49._4_4_;
    auVar180._8_4_ = fVar203 * auVar49._8_4_;
    auVar180._12_4_ = fVar205 * auVar49._12_4_;
    auVar39 = vminps_avx(auVar227,auVar224);
    auVar49 = vminps_avx512vl(auVar171,auVar180);
    auVar60 = vminps_avx512vl(auVar39,auVar49);
    auVar39 = vmaxps_avx(auVar224,auVar227);
    auVar49 = vmaxps_avx(auVar180,auVar171);
    auVar49 = vmaxps_avx(auVar49,auVar39);
    auVar53 = vminps_avx512vl(auVar233,auVar57);
    auVar39 = vminps_avx(auVar199,auVar217);
    auVar39 = vminps_avx(auVar53,auVar39);
    auVar39 = vhaddps_avx(auVar60,auVar39);
    auVar53 = vmaxps_avx512vl(auVar57,auVar233);
    auVar60 = vmaxps_avx(auVar217,auVar199);
    auVar60 = vmaxps_avx(auVar60,auVar53);
    auVar49 = vhaddps_avx(auVar49,auVar60);
    auVar39 = vshufps_avx(auVar39,auVar39,0xe8);
    auVar49 = vshufps_avx(auVar49,auVar49,0xe8);
    auVar172._0_4_ = auVar39._0_4_ + auVar56._0_4_;
    auVar172._4_4_ = auVar39._4_4_ + auVar56._4_4_;
    auVar172._8_4_ = auVar39._8_4_ + auVar56._8_4_;
    auVar172._12_4_ = auVar39._12_4_ + auVar56._12_4_;
    auVar181._0_4_ = auVar49._0_4_ + auVar56._0_4_;
    auVar181._4_4_ = auVar49._4_4_ + auVar56._4_4_;
    auVar181._8_4_ = auVar49._8_4_ + auVar56._8_4_;
    auVar181._12_4_ = auVar49._12_4_ + auVar56._12_4_;
    auVar39 = vmaxps_avx(auVar58,auVar172);
    auVar49 = vminps_avx(auVar181,auVar59);
    uVar24 = vcmpps_avx512vl(auVar49,auVar39,1);
    auVar39 = ZEXT416(5);
    if ((uVar24 & 3) != 0) {
      auVar36 = vxorps_avx512vl(ZEXT416(5),auVar39);
      auVar241 = ZEXT1664(auVar36);
      goto LAB_01ab11bb;
    }
    uVar24 = vcmpps_avx512vl(auVar181,auVar59,1);
    uVar15 = vcmpps_avx512vl(auVar36,auVar172,1);
    if (((ushort)uVar15 & (ushort)uVar24 & 1) == 0) {
      bVar27 = 0;
    }
    else {
      auVar49 = vmovshdup_avx(auVar172);
      bVar27 = auVar51._0_4_ < auVar49._0_4_ & (byte)(uVar24 >> 1) & 0x7f;
    }
    auVar39 = vxorps_avx512vl(auVar39,auVar39);
    auVar241 = ZEXT1664(auVar39);
    local_450 = auVar14._0_4_;
    fStack_44c = auVar14._4_4_;
    fStack_448 = auVar14._8_4_;
    fStack_444 = auVar14._12_4_;
    if (((3 < (uint)uVar22 || uVar5 != 0 && !bVar33) | bVar27) == 1) {
      lVar26 = 200;
      do {
        auVar36 = vsubss_avx512f(auVar40,auVar56);
        fVar203 = auVar36._0_4_;
        fVar208 = fVar203 * fVar203 * fVar203;
        fVar205 = auVar56._0_4_;
        fVar192 = fVar205 * 3.0 * fVar203 * fVar203;
        fVar203 = fVar203 * fVar205 * fVar205 * 3.0;
        auVar136._4_4_ = fVar208;
        auVar136._0_4_ = fVar208;
        auVar136._8_4_ = fVar208;
        auVar136._12_4_ = fVar208;
        auVar128._4_4_ = fVar192;
        auVar128._0_4_ = fVar192;
        auVar128._8_4_ = fVar192;
        auVar128._12_4_ = fVar192;
        auVar103._4_4_ = fVar203;
        auVar103._0_4_ = fVar203;
        auVar103._8_4_ = fVar203;
        auVar103._12_4_ = fVar203;
        fVar205 = fVar205 * fVar205 * fVar205;
        auVar154._0_4_ = local_450 * fVar205;
        auVar154._4_4_ = fStack_44c * fVar205;
        auVar154._8_4_ = fStack_448 * fVar205;
        auVar154._12_4_ = fStack_444 * fVar205;
        auVar36 = vfmadd231ps_fma(auVar154,auVar44,auVar103);
        auVar36 = vfmadd231ps_fma(auVar36,auVar47,auVar128);
        auVar36 = vfmadd231ps_fma(auVar36,auVar38,auVar136);
        auVar104._8_8_ = auVar36._0_8_;
        auVar104._0_8_ = auVar36._0_8_;
        auVar36 = vshufpd_avx(auVar36,auVar36,3);
        auVar49 = vshufps_avx(auVar56,auVar56,0x55);
        auVar36 = vsubps_avx(auVar36,auVar104);
        auVar49 = vfmadd213ps_fma(auVar36,auVar49,auVar104);
        fVar208 = auVar49._0_4_;
        auVar36 = vshufps_avx(auVar49,auVar49,0x55);
        auVar105._0_4_ = auVar50._0_4_ * fVar208 + auVar61._0_4_ * auVar36._0_4_;
        auVar105._4_4_ = auVar50._4_4_ * fVar208 + auVar61._4_4_ * auVar36._4_4_;
        auVar105._8_4_ = auVar50._8_4_ * fVar208 + auVar61._8_4_ * auVar36._8_4_;
        auVar105._12_4_ = auVar50._12_4_ * fVar208 + auVar61._12_4_ * auVar36._12_4_;
        auVar56 = vsubps_avx(auVar56,auVar105);
        auVar36 = vandps_avx512vl(auVar49,auVar239._0_16_);
        auVar49 = vprolq_avx512vl(auVar36,0x20);
        auVar36 = vmaxss_avx(auVar49,auVar36);
        bVar33 = auVar36._0_4_ <= fVar96;
        if (auVar36._0_4_ < fVar96) {
          auVar36 = vucomiss_avx512f(auVar39);
          if (bVar33) {
            auVar50 = vucomiss_avx512f(auVar36);
            auVar242 = ZEXT1664(auVar50);
            if (bVar33) {
              vmovshdup_avx(auVar36);
              auVar50 = vucomiss_avx512f(auVar39);
              if (bVar33) {
                auVar40 = vucomiss_avx512f(auVar50);
                auVar242 = ZEXT1664(auVar40);
                if (bVar33) {
                  auVar49 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                  auVar56 = vinsertps_avx(auVar49,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]
                                                         ),0x28);
                  auVar49 = vdpps_avx(auVar56,local_2a0,0x7f);
                  auVar58 = vdpps_avx(auVar56,local_2b0,0x7f);
                  auVar60 = vdpps_avx(auVar56,local_2c0,0x7f);
                  auVar53 = vdpps_avx(auVar56,local_2d0,0x7f);
                  auVar54 = vdpps_avx(auVar56,local_2e0,0x7f);
                  auVar57 = vdpps_avx(auVar56,local_2f0,0x7f);
                  auVar55 = vdpps_avx(auVar56,local_300,0x7f);
                  auVar56 = vdpps_avx(auVar56,local_310,0x7f);
                  auVar63 = vsubss_avx512f(auVar40,auVar50);
                  fVar208 = auVar50._0_4_;
                  auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * auVar54._0_4_)),auVar63,auVar49
                                           );
                  auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * fVar208)),auVar63,auVar58
                                           );
                  auVar58 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar208)),auVar63,auVar60
                                           );
                  auVar60 = vfmadd231ss_fma(ZEXT416((uint)(fVar208 * auVar56._0_4_)),auVar63,auVar53
                                           );
                  auVar40 = vsubss_avx512f(auVar40,auVar36);
                  auVar155._0_4_ = auVar40._0_4_;
                  fVar208 = auVar155._0_4_ * auVar155._0_4_ * auVar155._0_4_;
                  local_120 = auVar36._0_4_;
                  fVar192 = local_120 * 3.0 * auVar155._0_4_ * auVar155._0_4_;
                  fVar203 = auVar155._0_4_ * local_120 * local_120 * 3.0;
                  fVar205 = local_120 * local_120 * local_120;
                  auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar205 * auVar60._0_4_)),
                                            ZEXT416((uint)fVar203),auVar58);
                  auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar192),auVar49);
                  vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar208),auVar50);
                  auVar50 = vucomiss_avx512f(ZEXT416(uVar30));
                  if (bVar33) {
                    fVar207 = *(float *)(ray + k * 4 + 0x100);
                    if (auVar50._0_4_ <= fVar207) {
                      auVar40 = vshufps_avx(auVar36,auVar36,0x55);
                      auVar58 = vsubps_avx512vl(auVar41,auVar40);
                      fVar191 = auVar40._0_4_;
                      auVar182._0_4_ = fVar191 * (float)local_330._0_4_;
                      fVar202 = auVar40._4_4_;
                      auVar182._4_4_ = fVar202 * (float)local_330._4_4_;
                      fVar209 = auVar40._8_4_;
                      auVar182._8_4_ = fVar209 * fStack_328;
                      fVar218 = auVar40._12_4_;
                      auVar182._12_4_ = fVar218 * fStack_324;
                      auVar189._0_4_ = fVar191 * (float)local_380._0_4_;
                      auVar189._4_4_ = fVar202 * (float)local_380._4_4_;
                      auVar189._8_4_ = fVar209 * fStack_378;
                      auVar189._12_4_ = fVar218 * fStack_374;
                      auVar200._0_4_ = fVar191 * (float)local_390._0_4_;
                      auVar200._4_4_ = fVar202 * (float)local_390._4_4_;
                      auVar200._8_4_ = fVar209 * fStack_388;
                      auVar200._12_4_ = fVar218 * fStack_384;
                      auVar161._0_4_ = fVar191 * (float)local_350._0_4_;
                      auVar161._4_4_ = fVar202 * (float)local_350._4_4_;
                      auVar161._8_4_ = fVar209 * fStack_348;
                      auVar161._12_4_ = fVar218 * fStack_344;
                      auVar41 = vfmadd231ps_fma(auVar182,auVar58,local_320);
                      auVar40 = vfmadd231ps_fma(auVar189,auVar58,local_360);
                      auVar49 = vfmadd231ps_fma(auVar200,auVar58,local_370);
                      auVar58 = vfmadd231ps_fma(auVar161,auVar58,local_340);
                      auVar41 = vsubps_avx(auVar40,auVar41);
                      auVar40 = vsubps_avx(auVar49,auVar40);
                      auVar49 = vsubps_avx(auVar58,auVar49);
                      auVar201._0_4_ = local_120 * auVar40._0_4_;
                      auVar201._4_4_ = local_120 * auVar40._4_4_;
                      auVar201._8_4_ = local_120 * auVar40._8_4_;
                      auVar201._12_4_ = local_120 * auVar40._12_4_;
                      auVar155._4_4_ = auVar155._0_4_;
                      auVar155._8_4_ = auVar155._0_4_;
                      auVar155._12_4_ = auVar155._0_4_;
                      auVar41 = vfmadd231ps_fma(auVar201,auVar155,auVar41);
                      auVar162._0_4_ = local_120 * auVar49._0_4_;
                      auVar162._4_4_ = local_120 * auVar49._4_4_;
                      auVar162._8_4_ = local_120 * auVar49._8_4_;
                      auVar162._12_4_ = local_120 * auVar49._12_4_;
                      auVar40 = vfmadd231ps_fma(auVar162,auVar155,auVar40);
                      auVar163._0_4_ = local_120 * auVar40._0_4_;
                      auVar163._4_4_ = local_120 * auVar40._4_4_;
                      auVar163._8_4_ = local_120 * auVar40._8_4_;
                      auVar163._12_4_ = local_120 * auVar40._12_4_;
                      auVar41 = vfmadd231ps_fma(auVar163,auVar155,auVar41);
                      auVar41 = vmulps_avx512vl(auVar41,auVar228);
                      pGVar6 = (context->scene->geometries).items[uVar4].ptr;
                      if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
LAB_01ab211a:
                        bVar27 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar27 = 1, pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar149._0_4_ = fVar205 * (float)local_3e0._0_4_;
                        auVar149._4_4_ = fVar205 * (float)local_3e0._4_4_;
                        auVar149._8_4_ = fVar205 * fStack_3d8;
                        auVar149._12_4_ = fVar205 * fStack_3d4;
                        auVar137._4_4_ = fVar203;
                        auVar137._0_4_ = fVar203;
                        auVar137._8_4_ = fVar203;
                        auVar137._12_4_ = fVar203;
                        auVar40 = vfmadd132ps_fma(auVar137,auVar149,local_3d0);
                        auVar129._4_4_ = fVar192;
                        auVar129._0_4_ = fVar192;
                        auVar129._8_4_ = fVar192;
                        auVar129._12_4_ = fVar192;
                        auVar40 = vfmadd132ps_fma(auVar129,auVar40,local_3c0);
                        auVar123._4_4_ = fVar208;
                        auVar123._0_4_ = fVar208;
                        auVar123._8_4_ = fVar208;
                        auVar123._12_4_ = fVar208;
                        auVar58 = vfmadd132ps_fma(auVar123,auVar40,local_3b0);
                        auVar40 = vshufps_avx(auVar58,auVar58,0xc9);
                        auVar49 = vshufps_avx(auVar41,auVar41,0xc9);
                        auVar124._0_4_ = auVar58._0_4_ * auVar49._0_4_;
                        auVar124._4_4_ = auVar58._4_4_ * auVar49._4_4_;
                        auVar124._8_4_ = auVar58._8_4_ * auVar49._8_4_;
                        auVar124._12_4_ = auVar58._12_4_ * auVar49._12_4_;
                        auVar41 = vfmsub231ps_fma(auVar124,auVar41,auVar40);
                        auVar138._8_4_ = 1;
                        auVar138._0_8_ = 0x100000001;
                        auVar138._12_4_ = 1;
                        auVar138._16_4_ = 1;
                        auVar138._20_4_ = 1;
                        auVar138._24_4_ = 1;
                        auVar138._28_4_ = 1;
                        local_100 = vpermps_avx2(auVar138,ZEXT1632(auVar36));
                        auVar81 = vpermps_avx2(auVar138,ZEXT1632(auVar41));
                        auVar150._8_4_ = 2;
                        auVar150._0_8_ = 0x200000002;
                        auVar150._12_4_ = 2;
                        auVar150._16_4_ = 2;
                        auVar150._20_4_ = 2;
                        auVar150._24_4_ = 2;
                        auVar150._28_4_ = 2;
                        local_160 = vpermps_avx2(auVar150,ZEXT1632(auVar41));
                        local_140 = auVar41._0_4_;
                        local_180[0] = (RTCHitN)auVar81[0];
                        local_180[1] = (RTCHitN)auVar81[1];
                        local_180[2] = (RTCHitN)auVar81[2];
                        local_180[3] = (RTCHitN)auVar81[3];
                        local_180[4] = (RTCHitN)auVar81[4];
                        local_180[5] = (RTCHitN)auVar81[5];
                        local_180[6] = (RTCHitN)auVar81[6];
                        local_180[7] = (RTCHitN)auVar81[7];
                        local_180[8] = (RTCHitN)auVar81[8];
                        local_180[9] = (RTCHitN)auVar81[9];
                        local_180[10] = (RTCHitN)auVar81[10];
                        local_180[0xb] = (RTCHitN)auVar81[0xb];
                        local_180[0xc] = (RTCHitN)auVar81[0xc];
                        local_180[0xd] = (RTCHitN)auVar81[0xd];
                        local_180[0xe] = (RTCHitN)auVar81[0xe];
                        local_180[0xf] = (RTCHitN)auVar81[0xf];
                        local_180[0x10] = (RTCHitN)auVar81[0x10];
                        local_180[0x11] = (RTCHitN)auVar81[0x11];
                        local_180[0x12] = (RTCHitN)auVar81[0x12];
                        local_180[0x13] = (RTCHitN)auVar81[0x13];
                        local_180[0x14] = (RTCHitN)auVar81[0x14];
                        local_180[0x15] = (RTCHitN)auVar81[0x15];
                        local_180[0x16] = (RTCHitN)auVar81[0x16];
                        local_180[0x17] = (RTCHitN)auVar81[0x17];
                        local_180[0x18] = (RTCHitN)auVar81[0x18];
                        local_180[0x19] = (RTCHitN)auVar81[0x19];
                        local_180[0x1a] = (RTCHitN)auVar81[0x1a];
                        local_180[0x1b] = (RTCHitN)auVar81[0x1b];
                        local_180[0x1c] = (RTCHitN)auVar81[0x1c];
                        local_180[0x1d] = (RTCHitN)auVar81[0x1d];
                        local_180[0x1e] = (RTCHitN)auVar81[0x1e];
                        local_180[0x1f] = (RTCHitN)auVar81[0x1f];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        fStack_11c = local_120;
                        fStack_118 = local_120;
                        fStack_114 = local_120;
                        fStack_110 = local_120;
                        fStack_10c = local_120;
                        fStack_108 = local_120;
                        fStack_104 = local_120;
                        local_e0 = local_1e0._0_8_;
                        uStack_d8 = local_1e0._8_8_;
                        uStack_d0 = local_1e0._16_8_;
                        uStack_c8 = local_1e0._24_8_;
                        local_c0 = local_200;
                        vpcmpeqd_avx2(local_200,local_200);
                        uStack_9c = context->user->instID[0];
                        local_a0 = uStack_9c;
                        uStack_98 = uStack_9c;
                        uStack_94 = uStack_9c;
                        uStack_90 = uStack_9c;
                        uStack_8c = uStack_9c;
                        uStack_88 = uStack_9c;
                        uStack_84 = uStack_9c;
                        uStack_7c = context->user->instPrimID[0];
                        local_80 = uStack_7c;
                        uStack_78 = uStack_7c;
                        uStack_74 = uStack_7c;
                        uStack_70 = uStack_7c;
                        uStack_6c = uStack_7c;
                        uStack_68 = uStack_7c;
                        uStack_64 = uStack_7c;
                        *(float *)(ray + k * 4 + 0x100) = auVar50._0_4_;
                        local_400 = local_220;
                        local_430.valid = (int *)local_400;
                        local_430.geometryUserPtr = pGVar6->userPtr;
                        local_430.context = context->user;
                        local_430.ray = (RTCRayN *)ray;
                        local_430.hit = local_180;
                        local_430.N = 8;
                        if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar6->occlusionFilterN)(&local_430);
                          auVar242 = ZEXT464(0x3f800000);
                          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                          auVar235 = ZEXT1664(auVar36);
                          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar234 = ZEXT1664(auVar36);
                          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar240 = ZEXT1664(auVar36);
                        }
                        if (local_400 == (undefined1  [32])0x0) {
                          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar239 = ZEXT1664(auVar36);
                          auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar236 = ZEXT3264(auVar81);
                          auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                          auVar237 = ZEXT1664(auVar36);
                          auVar238 = ZEXT3264(_DAT_01feed20);
                          auVar36 = vxorps_avx512vl(auVar39,auVar39);
                          auVar241 = ZEXT1664(auVar36);
                        }
                        else {
                          p_Var9 = context->args->filter;
                          if (p_Var9 == (RTCFilterFunctionN)0x0) {
                            auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar239 = ZEXT1664(auVar36);
                            auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar236 = ZEXT3264(auVar81);
                            auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar237 = ZEXT1664(auVar36);
                            auVar238 = ZEXT3264(_DAT_01feed20);
                            auVar36 = vxorps_avx512vl(auVar39,auVar39);
                            auVar241 = ZEXT1664(auVar36);
                          }
                          else {
                            auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar239 = ZEXT1664(auVar36);
                            auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                            auVar236 = ZEXT3264(auVar81);
                            auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                            auVar237 = ZEXT1664(auVar36);
                            auVar238 = ZEXT3264(_DAT_01feed20);
                            auVar36 = vxorps_avx512vl(auVar39,auVar39);
                            auVar241 = ZEXT1664(auVar36);
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var9)(&local_430);
                              auVar36 = vxorps_avx512vl(auVar36,auVar36);
                              auVar241 = ZEXT1664(auVar36);
                              auVar242 = ZEXT464(0x3f800000);
                              auVar238 = ZEXT3264(_DAT_01feed20);
                              auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                              auVar237 = ZEXT1664(auVar36);
                              auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar236 = ZEXT3264(auVar81);
                              auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                              auVar235 = ZEXT1664(auVar36);
                              auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar234 = ZEXT1664(auVar36);
                              auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar240 = ZEXT1664(auVar36);
                              auVar36 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar239 = ZEXT1664(auVar36);
                            }
                          }
                          uVar24 = vptestmd_avx512vl(local_400,local_400);
                          auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar33 = (bool)((byte)uVar24 & 1);
                          bVar34 = (bool)((byte)(uVar24 >> 1) & 1);
                          bVar31 = (bool)((byte)(uVar24 >> 2) & 1);
                          bVar32 = (bool)((byte)(uVar24 >> 3) & 1);
                          bVar10 = (bool)((byte)(uVar24 >> 4) & 1);
                          bVar11 = (bool)((byte)(uVar24 >> 5) & 1);
                          bVar12 = (bool)((byte)(uVar24 >> 6) & 1);
                          bVar13 = SUB81(uVar24 >> 7,0);
                          *(uint *)(local_430.ray + 0x100) =
                               (uint)bVar33 * auVar81._0_4_ |
                               (uint)!bVar33 * *(int *)(local_430.ray + 0x100);
                          *(uint *)(local_430.ray + 0x104) =
                               (uint)bVar34 * auVar81._4_4_ |
                               (uint)!bVar34 * *(int *)(local_430.ray + 0x104);
                          *(uint *)(local_430.ray + 0x108) =
                               (uint)bVar31 * auVar81._8_4_ |
                               (uint)!bVar31 * *(int *)(local_430.ray + 0x108);
                          *(uint *)(local_430.ray + 0x10c) =
                               (uint)bVar32 * auVar81._12_4_ |
                               (uint)!bVar32 * *(int *)(local_430.ray + 0x10c);
                          *(uint *)(local_430.ray + 0x110) =
                               (uint)bVar10 * auVar81._16_4_ |
                               (uint)!bVar10 * *(int *)(local_430.ray + 0x110);
                          *(uint *)(local_430.ray + 0x114) =
                               (uint)bVar11 * auVar81._20_4_ |
                               (uint)!bVar11 * *(int *)(local_430.ray + 0x114);
                          *(uint *)(local_430.ray + 0x118) =
                               (uint)bVar12 * auVar81._24_4_ |
                               (uint)!bVar12 * *(int *)(local_430.ray + 0x118);
                          *(uint *)(local_430.ray + 0x11c) =
                               (uint)bVar13 * auVar81._28_4_ |
                               (uint)!bVar13 * *(int *)(local_430.ray + 0x11c);
                          bVar27 = 1;
                          if (local_400 != (undefined1  [32])0x0) goto LAB_01ab211c;
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar207;
                        goto LAB_01ab211a;
                      }
LAB_01ab211c:
                      bVar21 = (bool)(bVar21 | bVar27);
                    }
                  }
                }
              }
            }
          }
          break;
        }
        lVar26 = lVar26 + -1;
      } while (lVar26 != 0);
      goto LAB_01ab11bb;
    }
    auVar108 = vinsertps_avx(auVar51,auVar52,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }